

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_h<embree::avx2::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [28];
  byte bVar77;
  uint uVar78;
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  uint uVar82;
  long lVar83;
  Geometry *pGVar84;
  Geometry *geometry;
  bool bVar85;
  undefined8 uVar86;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar87 [16];
  float fVar103;
  float fVar105;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar93 [16];
  undefined1 auVar102 [32];
  undefined4 uVar108;
  vint4 bi_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar130 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [64];
  float fVar161;
  float fVar167;
  float fVar169;
  vint4 ai_1;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar168;
  float fVar170;
  float fVar172;
  undefined1 auVar165 [32];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar166 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  undefined1 auVar183 [64];
  undefined1 auVar195 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar188;
  float fVar192;
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined4 uVar193;
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  int local_7cc;
  Primitive *local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  ulong local_6b0;
  Precalculations *local_6a8;
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  ulong local_568;
  undefined1 local_560 [48];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_6a8 = pre;
  PVar6 = prim[1];
  uVar81 = (ulong)(byte)PVar6;
  fVar123 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar14 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar87._0_4_ = fVar123 * auVar14._0_4_;
  auVar87._4_4_ = fVar123 * auVar14._4_4_;
  auVar87._8_4_ = fVar123 * auVar14._8_4_;
  auVar87._12_4_ = fVar123 * auVar14._12_4_;
  auVar147._0_4_ = fVar123 * (ray->dir).field_0.m128[0];
  auVar147._4_4_ = fVar123 * (ray->dir).field_0.m128[1];
  auVar147._8_4_ = fVar123 * (ray->dir).field_0.m128[2];
  auVar147._12_4_ = fVar123 * (ray->dir).field_0.m128[3];
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar81 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar79 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar81 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar79 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar200._4_4_ = auVar147._0_4_;
  auVar200._0_4_ = auVar147._0_4_;
  auVar200._8_4_ = auVar147._0_4_;
  auVar200._12_4_ = auVar147._0_4_;
  auVar110 = vshufps_avx(auVar147,auVar147,0x55);
  auVar88 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar123 = auVar88._0_4_;
  auVar189._0_4_ = fVar123 * auVar10._0_4_;
  fVar103 = auVar88._4_4_;
  auVar189._4_4_ = fVar103 * auVar10._4_4_;
  fVar104 = auVar88._8_4_;
  auVar189._8_4_ = fVar104 * auVar10._8_4_;
  fVar105 = auVar88._12_4_;
  auVar189._12_4_ = fVar105 * auVar10._12_4_;
  auVar186._0_4_ = auVar13._0_4_ * fVar123;
  auVar186._4_4_ = auVar13._4_4_ * fVar103;
  auVar186._8_4_ = auVar13._8_4_ * fVar104;
  auVar186._12_4_ = auVar13._12_4_ * fVar105;
  auVar162._0_4_ = auVar124._0_4_ * fVar123;
  auVar162._4_4_ = auVar124._4_4_ * fVar103;
  auVar162._8_4_ = auVar124._8_4_ * fVar104;
  auVar162._12_4_ = auVar124._12_4_ * fVar105;
  auVar88 = vfmadd231ps_fma(auVar189,auVar110,auVar9);
  auVar111 = vfmadd231ps_fma(auVar186,auVar110,auVar12);
  auVar110 = vfmadd231ps_fma(auVar162,auVar89,auVar110);
  auVar136 = vfmadd231ps_fma(auVar88,auVar200,auVar14);
  auVar111 = vfmadd231ps_fma(auVar111,auVar200,auVar11);
  auVar144 = vfmadd231ps_fma(auVar110,auVar90,auVar200);
  auVar201._4_4_ = auVar87._0_4_;
  auVar201._0_4_ = auVar87._0_4_;
  auVar201._8_4_ = auVar87._0_4_;
  auVar201._12_4_ = auVar87._0_4_;
  auVar110 = vshufps_avx(auVar87,auVar87,0x55);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar123 = auVar88._0_4_;
  auVar148._0_4_ = fVar123 * auVar10._0_4_;
  fVar103 = auVar88._4_4_;
  auVar148._4_4_ = fVar103 * auVar10._4_4_;
  fVar104 = auVar88._8_4_;
  auVar148._8_4_ = fVar104 * auVar10._8_4_;
  fVar105 = auVar88._12_4_;
  auVar148._12_4_ = fVar105 * auVar10._12_4_;
  auVar109._0_4_ = auVar13._0_4_ * fVar123;
  auVar109._4_4_ = auVar13._4_4_ * fVar103;
  auVar109._8_4_ = auVar13._8_4_ * fVar104;
  auVar109._12_4_ = auVar13._12_4_ * fVar105;
  auVar88._0_4_ = auVar124._0_4_ * fVar123;
  auVar88._4_4_ = auVar124._4_4_ * fVar103;
  auVar88._8_4_ = auVar124._8_4_ * fVar104;
  auVar88._12_4_ = auVar124._12_4_ * fVar105;
  auVar9 = vfmadd231ps_fma(auVar148,auVar110,auVar9);
  auVar10 = vfmadd231ps_fma(auVar109,auVar110,auVar12);
  auVar12 = vfmadd231ps_fma(auVar88,auVar110,auVar89);
  auVar13 = vfmadd231ps_fma(auVar9,auVar201,auVar14);
  auVar89 = vfmadd231ps_fma(auVar10,auVar201,auVar11);
  auVar124 = vfmadd231ps_fma(auVar12,auVar201,auVar90);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar136,local_290);
  auVar143._8_4_ = 0x219392ef;
  auVar143._0_8_ = 0x219392ef219392ef;
  auVar143._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar143,1);
  auVar9 = vblendvps_avx(auVar136,auVar143,auVar14);
  auVar14 = vandps_avx(auVar111,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar143,1);
  auVar10 = vblendvps_avx(auVar111,auVar143,auVar14);
  auVar14 = vandps_avx(auVar144,local_290);
  auVar14 = vcmpps_avx(auVar14,auVar143,1);
  auVar14 = vblendvps_avx(auVar144,auVar143,auVar14);
  auVar11 = vrcpps_avx(auVar9);
  auVar159._8_4_ = 0x3f800000;
  auVar159._0_8_ = 0x3f8000003f800000;
  auVar159._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar159);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar10);
  auVar10 = vfnmadd213ps_fma(auVar10,auVar9,auVar159);
  auVar12 = vfmadd132ps_fma(auVar10,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar9,auVar159);
  auVar90 = vfmadd132ps_fma(auVar14,auVar9,auVar9);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar13);
  auVar144._0_4_ = auVar11._0_4_ * auVar14._0_4_;
  auVar144._4_4_ = auVar11._4_4_ * auVar14._4_4_;
  auVar144._8_4_ = auVar11._8_4_ * auVar14._8_4_;
  auVar144._12_4_ = auVar11._12_4_ * auVar14._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar9);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar13);
  auVar149._0_4_ = auVar11._0_4_ * auVar14._0_4_;
  auVar149._4_4_ = auVar11._4_4_ * auVar14._4_4_;
  auVar149._8_4_ = auVar11._8_4_ * auVar14._8_4_;
  auVar149._12_4_ = auVar11._12_4_ * auVar14._12_4_;
  auVar111._1_3_ = 0;
  auVar111[0] = PVar6;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar81 * -2 + 6);
  auVar14 = vpmovsxwd_avx(auVar11);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar89);
  auVar163._0_4_ = auVar14._0_4_ * auVar12._0_4_;
  auVar163._4_4_ = auVar14._4_4_ * auVar12._4_4_;
  auVar163._8_4_ = auVar14._8_4_ * auVar12._8_4_;
  auVar163._12_4_ = auVar14._12_4_ * auVar12._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar9);
  auVar14 = vsubps_avx(auVar14,auVar89);
  auVar110._0_4_ = auVar12._0_4_ * auVar14._0_4_;
  auVar110._4_4_ = auVar12._4_4_ * auVar14._4_4_;
  auVar110._8_4_ = auVar12._8_4_ * auVar14._8_4_;
  auVar110._12_4_ = auVar12._12_4_ * auVar14._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar79 + uVar81 + 6);
  auVar14 = vpmovsxwd_avx(auVar12);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar124);
  auVar136._0_4_ = auVar90._0_4_ * auVar14._0_4_;
  auVar136._4_4_ = auVar90._4_4_ * auVar14._4_4_;
  auVar136._8_4_ = auVar90._8_4_ * auVar14._8_4_;
  auVar136._12_4_ = auVar90._12_4_ * auVar14._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar13);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar124);
  auVar89._0_4_ = auVar90._0_4_ * auVar14._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar14._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar14._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar144,auVar149);
  auVar9 = vpminsd_avx(auVar163,auVar110);
  auVar14 = vmaxps_avx(auVar14,auVar9);
  auVar9 = vpminsd_avx(auVar136,auVar89);
  uVar108 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar176._4_4_ = uVar108;
  auVar176._0_4_ = uVar108;
  auVar176._8_4_ = uVar108;
  auVar176._12_4_ = uVar108;
  auVar9 = vmaxps_avx(auVar9,auVar176);
  auVar14 = vmaxps_avx(auVar14,auVar9);
  local_2a0._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar144,auVar149);
  auVar9 = vpmaxsd_avx(auVar163,auVar110);
  auVar14 = vminps_avx(auVar14,auVar9);
  auVar9 = vpmaxsd_avx(auVar136,auVar89);
  fVar123 = ray->tfar;
  auVar124._4_4_ = fVar123;
  auVar124._0_4_ = fVar123;
  auVar124._8_4_ = fVar123;
  auVar124._12_4_ = fVar123;
  auVar9 = vminps_avx(auVar9,auVar124);
  auVar14 = vminps_avx(auVar14,auVar9);
  auVar90._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar111[4] = PVar6;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar6;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar6;
  auVar111._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar111,_DAT_01f7fcf0);
  auVar14 = vcmpps_avx(local_2a0,auVar90,2);
  auVar14 = vandps_avx(auVar14,auVar9);
  uVar78 = vmovmskps_avx(auVar14);
  if (uVar78 == 0) {
    bVar85 = false;
  }
  else {
    uVar78 = uVar78 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_7c8 = prim;
    do {
      lVar19 = 0;
      for (uVar79 = (ulong)uVar78; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      local_6b0 = (ulong)*(uint *)(local_7c8 + 2);
      pGVar84 = (context->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
      local_568 = (ulong)*(uint *)(local_7c8 + lVar19 * 4 + 6);
      uVar79 = (ulong)*(uint *)(*(long *)&pGVar84->field_0x58 +
                               (ulong)*(uint *)(local_7c8 + lVar19 * 4 + 6) *
                               pGVar84[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar83 = (long)pGVar84[1].intersectionFilterN * uVar79;
      lVar80 = (long)pGVar84[1].intersectionFilterN * (uVar79 + 1);
      lVar19 = *(long *)&pGVar84[1].time_range.upper;
      local_530 = *(undefined1 (*) [16])(lVar19 + lVar83);
      _local_410 = *(undefined1 (*) [16])(lVar19 + lVar80);
      auVar91._8_4_ = 0xbeaaaaab;
      auVar91._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar91._12_4_ = 0xbeaaaaab;
      local_5b0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar84[2].intersectionFilterN +
                                    uVar79 * (long)pGVar84[2].pointQueryFunc),local_530,auVar91);
      local_5c0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar84[2].intersectionFilterN +
                                   (long)pGVar84[2].pointQueryFunc * (uVar79 + 1)),_local_410,
                                  auVar91);
      aVar4 = (ray->org).field_0;
      auVar136 = local_530;
      auVar10 = vsubps_avx(local_530,(undefined1  [16])aVar4);
      auVar14 = vshufps_avx(auVar10,auVar10,0x55);
      auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
      aVar5 = (local_6a8->ray_space).vy.field_0;
      fVar123 = (local_6a8->ray_space).vz.field_0.m128[0];
      fVar103 = (local_6a8->ray_space).vz.field_0.m128[1];
      fVar104 = (local_6a8->ray_space).vz.field_0.m128[2];
      fVar105 = (local_6a8->ray_space).vz.field_0.m128[3];
      auVar164._0_4_ = auVar9._0_4_ * fVar123;
      auVar164._4_4_ = auVar9._4_4_ * fVar103;
      auVar164._8_4_ = auVar9._8_4_ * fVar104;
      auVar164._12_4_ = auVar9._12_4_ * fVar105;
      auVar90 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar14);
      uVar108 = *(undefined4 *)(lVar19 + 0xc + lVar83);
      auVar194._4_4_ = uVar108;
      auVar194._0_4_ = uVar108;
      auVar194._8_4_ = uVar108;
      auVar194._12_4_ = uVar108;
      local_260._16_4_ = uVar108;
      local_260._0_16_ = auVar194;
      local_260._20_4_ = uVar108;
      local_260._24_4_ = uVar108;
      local_260._28_4_ = uVar108;
      auVar11 = vsubps_avx(local_5b0,(undefined1  [16])aVar4);
      auVar111 = local_5b0;
      auVar14 = vshufps_avx(auVar11,auVar11,0x55);
      auVar9 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar177._0_4_ = auVar9._0_4_ * fVar123;
      auVar177._4_4_ = auVar9._4_4_ * fVar103;
      auVar177._8_4_ = auVar9._8_4_ * fVar104;
      auVar177._12_4_ = auVar9._12_4_ * fVar105;
      auVar89 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar5,auVar14);
      auVar12 = vsubps_avx(local_5c0,(undefined1  [16])aVar4);
      auVar88 = local_5c0;
      auVar14 = vshufps_avx(auVar12,auVar12,0x55);
      auVar9 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar187._0_4_ = auVar9._0_4_ * fVar123;
      auVar187._4_4_ = auVar9._4_4_ * fVar103;
      auVar187._8_4_ = auVar9._8_4_ * fVar104;
      auVar187._12_4_ = auVar9._12_4_ * fVar105;
      auVar124 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar14);
      local_560._0_16_ = (undefined1  [16])aVar4;
      auVar13 = vsubps_avx(_local_410,(undefined1  [16])aVar4);
      auVar14 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar157._0_4_ = auVar14._0_4_ * fVar123;
      auVar157._4_4_ = auVar14._4_4_ * fVar103;
      auVar157._8_4_ = auVar14._8_4_ * fVar104;
      auVar157._12_4_ = auVar14._12_4_ * fVar105;
      auVar14 = vshufps_avx(auVar13,auVar13,0x55);
      auVar110 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar5,auVar14);
      fVar123 = *(float *)(lVar19 + 0xc + lVar80);
      auVar150._4_4_ = fVar123;
      auVar150._0_4_ = fVar123;
      auVar150._8_4_ = fVar123;
      auVar150._12_4_ = fVar123;
      fStack_270 = fVar123;
      _local_280 = auVar150;
      fStack_26c = fVar123;
      fStack_268 = fVar123;
      uStack_264 = fVar123;
      iVar7 = (int)pGVar84[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar19 = (long)iVar7 * 0x44;
      auVar92._0_4_ = auVar10._0_4_;
      auVar92._4_4_ = auVar92._0_4_;
      auVar92._8_4_ = auVar92._0_4_;
      auVar92._12_4_ = auVar92._0_4_;
      aVar5 = (local_6a8->ray_space).vx.field_0;
      auVar90 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar5,auVar92);
      auVar14 = vinsertps_avx(auVar90,auVar194,0x30);
      auVar112._0_4_ = auVar11._0_4_;
      auVar112._4_4_ = auVar112._0_4_;
      auVar112._8_4_ = auVar112._0_4_;
      auVar112._12_4_ = auVar112._0_4_;
      auVar89 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar112);
      auVar9 = vblendps_avx(auVar89,local_5b0,8);
      auVar125._0_4_ = auVar12._0_4_;
      auVar125._4_4_ = auVar125._0_4_;
      auVar125._8_4_ = auVar125._0_4_;
      auVar125._12_4_ = auVar125._0_4_;
      auVar124 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar5,auVar125);
      auVar10 = vblendps_avx(auVar124,local_5c0,8);
      auVar137._0_4_ = auVar13._0_4_;
      auVar137._4_4_ = auVar137._0_4_;
      auVar137._8_4_ = auVar137._0_4_;
      auVar137._12_4_ = auVar137._0_4_;
      auVar13 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar137);
      auVar11 = vinsertps_avx(auVar13,auVar150,0x30);
      auVar14 = vandps_avx(auVar14,local_290);
      auVar9 = vandps_avx(auVar9,local_290);
      auVar12 = vmaxps_avx(auVar14,auVar9);
      auVar14 = vandps_avx(auVar10,local_290);
      auVar9 = vandps_avx(auVar11,local_290);
      auVar14 = vmaxps_avx(auVar14,auVar9);
      auVar14 = vmaxps_avx(auVar12,auVar14);
      auVar9 = vmovshdup_avx(auVar14);
      auVar9 = vmaxss_avx(auVar9,auVar14);
      auVar14 = vshufpd_avx(auVar14,auVar14,1);
      auVar14 = vmaxss_avx(auVar14,auVar9);
      auVar9 = vmovshdup_avx(auVar90);
      uVar86 = auVar9._0_8_;
      local_440._8_8_ = uVar86;
      local_440._0_8_ = uVar86;
      local_440._16_8_ = uVar86;
      local_440._24_8_ = uVar86;
      auVar10 = vmovshdup_avx(auVar89);
      uVar86 = auVar10._0_8_;
      local_780._8_8_ = uVar86;
      local_780._0_8_ = uVar86;
      local_780._16_8_ = uVar86;
      local_780._24_8_ = uVar86;
      auVar10 = vmovshdup_avx(auVar124);
      uVar86 = auVar10._0_8_;
      local_6e0._8_8_ = uVar86;
      local_6e0._0_8_ = uVar86;
      local_6e0._16_8_ = uVar86;
      local_6e0._24_8_ = uVar86;
      auVar10 = vmovshdup_avx(auVar13);
      local_660 = auVar10._0_8_;
      auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x908);
      uVar108 = auVar124._0_4_;
      local_700._4_4_ = uVar108;
      local_700._0_4_ = uVar108;
      local_700._8_4_ = uVar108;
      local_700._12_4_ = uVar108;
      local_700._16_4_ = uVar108;
      local_700._20_4_ = uVar108;
      local_700._24_4_ = uVar108;
      local_700._28_4_ = uVar108;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar19 + 0xd8c);
      fVar103 = *(float *)*pauVar1;
      fVar104 = *(float *)(bezier_basis0 + lVar19 + 0xd90);
      fVar105 = *(float *)(bezier_basis0 + lVar19 + 0xd94);
      fVar106 = *(float *)(bezier_basis0 + lVar19 + 0xd98);
      fVar122 = *(float *)(bezier_basis0 + lVar19 + 0xd9c);
      fVar107 = *(float *)(bezier_basis0 + lVar19 + 0xda0);
      fVar168 = *(float *)(bezier_basis0 + lVar19 + 0xda4);
      auVar76 = *(undefined1 (*) [28])*pauVar1;
      local_680 = auVar13._0_4_;
      auVar145._0_4_ = fVar103 * local_680;
      auVar145._4_4_ = fVar104 * local_680;
      auVar145._8_4_ = fVar105 * local_680;
      auVar145._12_4_ = fVar106 * local_680;
      auVar145._16_4_ = fVar122 * local_680;
      auVar145._20_4_ = fVar107 * local_680;
      auVar145._24_4_ = fVar168 * local_680;
      auVar145._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar145,auVar133,local_700);
      fVar188 = auVar10._0_4_;
      auVar113._0_4_ = fVar188 * fVar103;
      fVar192 = auVar10._4_4_;
      auVar113._4_4_ = fVar192 * fVar104;
      auVar113._8_4_ = fVar188 * fVar105;
      auVar113._12_4_ = fVar192 * fVar106;
      auVar113._16_4_ = fVar188 * fVar122;
      auVar113._20_4_ = fVar192 * fVar107;
      auVar113._24_4_ = fVar188 * fVar168;
      auVar113._28_4_ = 0;
      auVar10 = vfmadd231ps_fma(auVar113,auVar133,local_6e0);
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x484);
      local_6a0._0_4_ = auVar89._0_4_;
      local_6a0._4_4_ = local_6a0._0_4_;
      local_6a0._8_4_ = local_6a0._0_4_;
      local_6a0._12_4_ = local_6a0._0_4_;
      local_6a0._16_4_ = local_6a0._0_4_;
      local_6a0._20_4_ = local_6a0._0_4_;
      local_6a0._24_4_ = local_6a0._0_4_;
      local_6a0._28_4_ = local_6a0._0_4_;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar113,local_6a0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar113,local_780);
      auVar145 = *(undefined1 (*) [32])(bezier_basis0 + lVar19);
      uVar193 = auVar90._0_4_;
      local_5e0._4_4_ = uVar193;
      local_5e0._0_4_ = uVar193;
      local_5e0._8_4_ = uVar193;
      local_5e0._12_4_ = uVar193;
      local_5e0._16_4_ = uVar193;
      local_5e0._20_4_ = uVar193;
      local_5e0._24_4_ = uVar193;
      local_5e0._28_4_ = uVar193;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar145,local_5e0);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar145,local_440);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x908);
      fVar170 = *(float *)(bezier_basis1 + lVar19 + 0xd8c);
      fVar172 = *(float *)(bezier_basis1 + lVar19 + 0xd90);
      fVar184 = *(float *)(bezier_basis1 + lVar19 + 0xd94);
      fVar185 = *(float *)(bezier_basis1 + lVar19 + 0xd98);
      fVar71 = *(float *)(bezier_basis1 + lVar19 + 0xd9c);
      fVar72 = *(float *)(bezier_basis1 + lVar19 + 0xda0);
      fVar73 = *(float *)(bezier_basis1 + lVar19 + 0xda4);
      fStack_67c = local_680;
      fStack_678 = local_680;
      fStack_674 = local_680;
      fStack_670 = local_680;
      fStack_66c = local_680;
      fStack_668 = local_680;
      fStack_664 = local_680;
      auVar101._4_4_ = fVar172 * local_680;
      auVar101._0_4_ = fVar170 * local_680;
      auVar101._8_4_ = fVar184 * local_680;
      auVar101._12_4_ = fVar185 * local_680;
      auVar101._16_4_ = fVar71 * local_680;
      auVar101._20_4_ = fVar72 * local_680;
      auVar101._24_4_ = fVar73 * local_680;
      auVar101._28_4_ = local_680;
      auVar12 = vfmadd231ps_fma(auVar101,auVar102,local_700);
      uStack_658 = local_660;
      uStack_650 = local_660;
      uStack_648 = local_660;
      auVar118._4_4_ = fVar192 * fVar172;
      auVar118._0_4_ = fVar188 * fVar170;
      auVar118._8_4_ = fVar188 * fVar184;
      auVar118._12_4_ = fVar192 * fVar185;
      auVar118._16_4_ = fVar188 * fVar71;
      auVar118._20_4_ = fVar192 * fVar72;
      auVar118._24_4_ = fVar188 * fVar73;
      auVar118._28_4_ = uVar108;
      auVar110 = vfmadd231ps_fma(auVar118,auVar102,local_6e0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x484);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,local_6a0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar101,local_780);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar19);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_5e0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar118,local_440);
      auVar94 = ZEXT1632(auVar12);
      local_300 = ZEXT1632(auVar11);
      auVar15 = vsubps_avx(auVar94,local_300);
      local_2e0 = ZEXT1632(auVar110);
      _local_320 = ZEXT1632(auVar10);
      auVar16 = vsubps_avx(local_2e0,_local_320);
      auVar95._0_4_ = auVar10._0_4_ * auVar15._0_4_;
      auVar95._4_4_ = auVar10._4_4_ * auVar15._4_4_;
      auVar95._8_4_ = auVar10._8_4_ * auVar15._8_4_;
      auVar95._12_4_ = auVar10._12_4_ * auVar15._12_4_;
      auVar95._16_4_ = auVar15._16_4_ * 0.0;
      auVar95._20_4_ = auVar15._20_4_ * 0.0;
      auVar95._24_4_ = auVar15._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      fVar161 = auVar16._0_4_;
      auVar114._0_4_ = fVar161 * auVar11._0_4_;
      fVar167 = auVar16._4_4_;
      auVar114._4_4_ = fVar167 * auVar11._4_4_;
      fVar169 = auVar16._8_4_;
      auVar114._8_4_ = fVar169 * auVar11._8_4_;
      fVar171 = auVar16._12_4_;
      auVar114._12_4_ = fVar171 * auVar11._12_4_;
      fVar173 = auVar16._16_4_;
      auVar114._16_4_ = fVar173 * 0.0;
      fVar174 = auVar16._20_4_;
      auVar114._20_4_ = fVar174 * 0.0;
      fVar175 = auVar16._24_4_;
      auVar114._24_4_ = fVar175 * 0.0;
      auVar114._28_4_ = 0;
      auVar95 = vsubps_avx(auVar95,auVar114);
      auVar10 = vpermilps_avx(local_5b0,0xff);
      uVar86 = auVar10._0_8_;
      local_80._8_8_ = uVar86;
      local_80._0_8_ = uVar86;
      local_80._16_8_ = uVar86;
      local_80._24_8_ = uVar86;
      auVar11 = vpermilps_avx(local_5c0,0xff);
      local_a0._0_8_ = auVar11._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      _local_3e0 = *pauVar1;
      auVar114 = _local_3e0;
      auVar178._4_4_ = fVar104 * fVar123;
      auVar178._0_4_ = fVar103 * fVar123;
      auVar178._8_4_ = fVar105 * fVar123;
      auVar178._12_4_ = fVar106 * fVar123;
      auVar178._16_4_ = fVar122 * fVar123;
      auVar178._20_4_ = fVar107 * fVar123;
      auVar178._24_4_ = fVar168 * fVar123;
      auVar178._28_4_ = auVar9._4_4_;
      auVar9 = vfmadd231ps_fma(auVar178,auVar133,local_a0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar113,local_80);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar145,local_260);
      auVar179._4_4_ = fVar172 * fVar123;
      auVar179._0_4_ = fVar170 * fVar123;
      auVar179._8_4_ = fVar184 * fVar123;
      auVar179._12_4_ = fVar185 * fVar123;
      auVar179._16_4_ = fVar71 * fVar123;
      auVar179._20_4_ = fVar72 * fVar123;
      auVar179._24_4_ = fVar73 * fVar123;
      auVar179._28_4_ = auVar145._28_4_;
      auVar9 = vfmadd231ps_fma(auVar179,auVar102,local_a0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar101,local_80);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar118,local_260);
      auVar195._4_4_ = fVar167 * fVar167;
      auVar195._0_4_ = fVar161 * fVar161;
      auVar195._8_4_ = fVar169 * fVar169;
      auVar195._12_4_ = fVar171 * fVar171;
      auVar195._16_4_ = fVar173 * fVar173;
      auVar195._20_4_ = fVar174 * fVar174;
      auVar195._24_4_ = fVar175 * fVar175;
      auVar195._28_4_ = auVar10._4_4_;
      auVar9 = vfmadd231ps_fma(auVar195,auVar15,auVar15);
      auVar178 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
      auVar17._4_4_ = auVar178._4_4_ * auVar178._4_4_ * auVar9._4_4_;
      auVar17._0_4_ = auVar178._0_4_ * auVar178._0_4_ * auVar9._0_4_;
      auVar17._8_4_ = auVar178._8_4_ * auVar178._8_4_ * auVar9._8_4_;
      auVar17._12_4_ = auVar178._12_4_ * auVar178._12_4_ * auVar9._12_4_;
      auVar17._16_4_ = auVar178._16_4_ * auVar178._16_4_ * 0.0;
      auVar17._20_4_ = auVar178._20_4_ * auVar178._20_4_ * 0.0;
      auVar17._24_4_ = auVar178._24_4_ * auVar178._24_4_ * 0.0;
      auVar17._28_4_ = auVar178._28_4_;
      auVar18._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar18._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar18._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar18._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar18._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar18._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar18._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar18._28_4_ = auVar95._28_4_;
      auVar178 = vcmpps_avx(auVar18,auVar17,2);
      auVar135 = ZEXT3264(auVar178);
      auVar96._0_4_ = (float)iVar7;
      fVar123 = auVar14._0_4_ * 4.7683716e-07;
      local_400._0_16_ = ZEXT416((uint)auVar96._0_4_);
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar96._16_4_ = auVar96._0_4_;
      auVar96._20_4_ = auVar96._0_4_;
      auVar96._24_4_ = auVar96._0_4_;
      auVar96._28_4_ = auVar96._0_4_;
      auVar95 = vcmpps_avx(_DAT_01faff40,auVar96,1);
      auVar14 = vpermilps_avx(auVar90,0xaa);
      uVar86 = auVar14._0_8_;
      local_500._8_8_ = uVar86;
      local_500._0_8_ = uVar86;
      local_500._16_8_ = uVar86;
      local_500._24_8_ = uVar86;
      auVar14 = vpermilps_avx(auVar89,0xaa);
      uVar86 = auVar14._0_8_;
      local_3c0._8_8_ = uVar86;
      local_3c0._0_8_ = uVar86;
      local_3c0._16_8_ = uVar86;
      local_3c0._24_8_ = uVar86;
      auVar9 = vpermilps_avx(auVar124,0xaa);
      uVar86 = auVar9._0_8_;
      local_3a0._8_8_ = uVar86;
      local_3a0._0_8_ = uVar86;
      local_3a0._16_8_ = uVar86;
      local_3a0._24_8_ = uVar86;
      auVar10 = vpermilps_avx(auVar13,0xaa);
      uStack_2b8 = auVar10._0_8_;
      auVar179 = auVar95 & auVar178;
      local_2c0 = uStack_2b8;
      uStack_2b0 = uStack_2b8;
      uStack_2a8 = uStack_2b8;
      local_760._0_16_ = ZEXT416((uint)fVar123);
      if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar179 >> 0x7f,0) == '\0') &&
            (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar179 >> 0xbf,0) == '\0') &&
          (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar179[0x1f]) {
        bVar85 = false;
LAB_015eb7f6:
        auVar183 = ZEXT3264(local_720);
        auVar198 = ZEXT3264(local_740);
        auVar203 = ZEXT3264(local_6e0);
        auVar204 = ZEXT3264(local_700);
        fVar188 = (float)local_660;
        fVar192 = local_660._4_4_;
        fVar123 = (float)uStack_658;
        fVar103 = uStack_658._4_4_;
        fVar104 = (float)uStack_650;
        fVar105 = uStack_650._4_4_;
        fVar106 = (float)uStack_648;
LAB_015ebe12:
        auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                      CONCAT424(fStack_668,
                                                CONCAT420(fStack_66c,
                                                          CONCAT416(fStack_670,
                                                                    CONCAT412(fStack_674,
                                                                              CONCAT48(fStack_678,
                                                                                       CONCAT44(
                                                  fStack_67c,local_680))))))));
        auVar166 = ZEXT3264(local_6a0);
LAB_015ebe24:
        auVar121 = ZEXT3264(local_780);
        auVar142 = ZEXT3264(local_5e0);
      }
      else {
        local_340 = vandps_avx(auVar178,auVar95);
        fVar103 = auVar10._0_4_;
        fVar104 = auVar10._4_4_;
        auVar20._4_4_ = fVar172 * fVar104;
        auVar20._0_4_ = fVar170 * fVar103;
        auVar20._8_4_ = fVar184 * fVar103;
        auVar20._12_4_ = fVar185 * fVar104;
        auVar20._16_4_ = fVar71 * fVar103;
        auVar20._20_4_ = fVar72 * fVar104;
        auVar20._24_4_ = fVar73 * fVar103;
        auVar20._28_4_ = local_340._28_4_;
        auVar10 = vfmadd213ps_fma(auVar102,local_3a0,auVar20);
        auVar10 = vfmadd213ps_fma(auVar101,local_3c0,ZEXT1632(auVar10));
        auVar10 = vfmadd213ps_fma(auVar118,local_500,ZEXT1632(auVar10));
        local_3e0._0_4_ = auVar76._0_4_;
        local_3e0._4_4_ = auVar76._4_4_;
        fStack_3d8 = auVar76._8_4_;
        fStack_3d4 = auVar76._12_4_;
        fStack_3d0 = auVar76._16_4_;
        fStack_3cc = auVar76._20_4_;
        fStack_3c8 = auVar76._24_4_;
        auVar97._0_4_ = fVar103 * (float)local_3e0._0_4_;
        auVar97._4_4_ = fVar104 * (float)local_3e0._4_4_;
        auVar97._8_4_ = fVar103 * fStack_3d8;
        auVar97._12_4_ = fVar104 * fStack_3d4;
        auVar97._16_4_ = fVar103 * fStack_3d0;
        auVar97._20_4_ = fVar104 * fStack_3cc;
        auVar97._24_4_ = fVar103 * fStack_3c8;
        auVar97._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(auVar133,local_3a0,auVar97);
        auVar13 = vfmadd213ps_fma(auVar113,local_3c0,ZEXT1632(auVar13));
        auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1210);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar19 + 0x1b18);
        fVar105 = *(float *)(bezier_basis0 + lVar19 + 0x1f9c);
        fVar106 = *(float *)(bezier_basis0 + lVar19 + 0x1fa0);
        fVar122 = *(float *)(bezier_basis0 + lVar19 + 0x1fa4);
        fVar107 = *(float *)(bezier_basis0 + lVar19 + 0x1fa8);
        fVar168 = *(float *)(bezier_basis0 + lVar19 + 0x1fac);
        fVar170 = *(float *)(bezier_basis0 + lVar19 + 0x1fb0);
        fVar172 = *(float *)(bezier_basis0 + lVar19 + 0x1fb4);
        auVar21._4_4_ = local_680 * fVar106;
        auVar21._0_4_ = local_680 * fVar105;
        auVar21._8_4_ = local_680 * fVar122;
        auVar21._12_4_ = local_680 * fVar107;
        auVar21._16_4_ = local_680 * fVar168;
        auVar21._20_4_ = local_680 * fVar170;
        auVar21._24_4_ = local_680 * fVar172;
        auVar21._28_4_ = auVar15._28_4_;
        auVar22._4_4_ = fVar192 * fVar106;
        auVar22._0_4_ = fVar188 * fVar105;
        auVar22._8_4_ = fVar188 * fVar122;
        auVar22._12_4_ = fVar192 * fVar107;
        auVar22._16_4_ = fVar188 * fVar168;
        auVar22._20_4_ = fVar192 * fVar170;
        auVar22._24_4_ = fVar188 * fVar172;
        auVar22._28_4_ = auVar14._4_4_;
        auVar23._4_4_ = fVar104 * fVar106;
        auVar23._0_4_ = fVar103 * fVar105;
        auVar23._8_4_ = fVar103 * fVar122;
        auVar23._12_4_ = fVar104 * fVar107;
        auVar23._16_4_ = fVar103 * fVar168;
        auVar23._20_4_ = fVar104 * fVar170;
        auVar23._24_4_ = fVar103 * fVar172;
        auVar23._28_4_ = auVar9._4_4_;
        auVar14 = vfmadd231ps_fma(auVar21,auVar102,local_700);
        auVar9 = vfmadd231ps_fma(auVar22,auVar102,local_6e0);
        auVar90 = vfmadd231ps_fma(auVar23,local_3a0,auVar102);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar113,local_6a0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar113,local_780);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_3c0,auVar113);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar133,local_5e0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar133,local_440);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar133,local_500);
        fVar105 = *(float *)(bezier_basis1 + lVar19 + 0x1f9c);
        fVar106 = *(float *)(bezier_basis1 + lVar19 + 0x1fa0);
        fVar122 = *(float *)(bezier_basis1 + lVar19 + 0x1fa4);
        fVar107 = *(float *)(bezier_basis1 + lVar19 + 0x1fa8);
        fVar168 = *(float *)(bezier_basis1 + lVar19 + 0x1fac);
        fVar170 = *(float *)(bezier_basis1 + lVar19 + 0x1fb0);
        fVar172 = *(float *)(bezier_basis1 + lVar19 + 0x1fb4);
        auVar102._4_4_ = local_680 * fVar106;
        auVar102._0_4_ = local_680 * fVar105;
        auVar102._8_4_ = local_680 * fVar122;
        auVar102._12_4_ = local_680 * fVar107;
        auVar102._16_4_ = local_680 * fVar168;
        auVar102._20_4_ = local_680 * fVar170;
        auVar102._24_4_ = local_680 * fVar172;
        auVar102._28_4_ = local_680;
        auVar24._4_4_ = fVar192 * fVar106;
        auVar24._0_4_ = fVar188 * fVar105;
        auVar24._8_4_ = fVar188 * fVar122;
        auVar24._12_4_ = fVar192 * fVar107;
        auVar24._16_4_ = fVar188 * fVar168;
        auVar24._20_4_ = fVar192 * fVar170;
        auVar24._24_4_ = fVar188 * fVar172;
        auVar24._28_4_ = fVar192;
        auVar25._4_4_ = fVar104 * fVar106;
        auVar25._0_4_ = fVar103 * fVar105;
        auVar25._8_4_ = fVar103 * fVar122;
        auVar25._12_4_ = fVar104 * fVar107;
        auVar25._16_4_ = fVar103 * fVar168;
        auVar25._20_4_ = fVar104 * fVar170;
        auVar25._24_4_ = fVar103 * fVar172;
        auVar25._28_4_ = *(undefined4 *)(bezier_basis0 + lVar19 + 0x1fb8);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1b18);
        auVar89 = vfmadd231ps_fma(auVar102,auVar133,local_700);
        auVar124 = vfmadd231ps_fma(auVar24,auVar133,local_6e0);
        auVar110 = vfmadd231ps_fma(auVar25,auVar133,local_3a0);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1694);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar133,local_6a0);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar133,local_780);
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar133,local_3c0);
        auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar19 + 0x1210);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar133,local_5e0);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar133,local_440);
        auVar115._8_4_ = 0x7fffffff;
        auVar115._0_8_ = 0x7fffffff7fffffff;
        auVar115._12_4_ = 0x7fffffff;
        auVar115._16_4_ = 0x7fffffff;
        auVar115._20_4_ = 0x7fffffff;
        auVar115._24_4_ = 0x7fffffff;
        auVar115._28_4_ = 0x7fffffff;
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_500,auVar133);
        auVar133 = vandps_avx(ZEXT1632(auVar14),auVar115);
        auVar113 = vandps_avx(ZEXT1632(auVar9),auVar115);
        auVar113 = vmaxps_avx(auVar133,auVar113);
        auVar133 = vandps_avx(ZEXT1632(auVar90),auVar115);
        auVar133 = vmaxps_avx(auVar113,auVar133);
        auVar130._4_4_ = fVar123;
        auVar130._0_4_ = fVar123;
        auVar130._8_4_ = fVar123;
        auVar130._12_4_ = fVar123;
        auVar130._16_4_ = fVar123;
        auVar130._20_4_ = fVar123;
        auVar130._24_4_ = fVar123;
        auVar130._28_4_ = fVar123;
        auVar133 = vcmpps_avx(auVar133,auVar130,1);
        auVar102 = vblendvps_avx(ZEXT1632(auVar14),auVar15,auVar133);
        auVar101 = vblendvps_avx(ZEXT1632(auVar9),auVar16,auVar133);
        auVar133 = vandps_avx(ZEXT1632(auVar89),auVar115);
        auVar113 = vandps_avx(ZEXT1632(auVar124),auVar115);
        auVar113 = vmaxps_avx(auVar133,auVar113);
        auVar133 = vandps_avx(ZEXT1632(auVar110),auVar115);
        auVar133 = vmaxps_avx(auVar113,auVar133);
        auVar118 = vcmpps_avx(auVar133,auVar130,1);
        auVar133 = vblendvps_avx(ZEXT1632(auVar89),auVar15,auVar118);
        auVar113 = vblendvps_avx(ZEXT1632(auVar124),auVar16,auVar118);
        auVar14 = vfmadd213ps_fma(auVar145,local_500,ZEXT1632(auVar13));
        auVar9 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar101,auVar101);
        auVar145 = vrsqrtps_avx(ZEXT1632(auVar9));
        fVar123 = auVar145._0_4_;
        fVar103 = auVar145._4_4_;
        fVar104 = auVar145._8_4_;
        fVar105 = auVar145._12_4_;
        fVar106 = auVar145._16_4_;
        fVar122 = auVar145._20_4_;
        fVar107 = auVar145._24_4_;
        auVar15._4_4_ = fVar103 * fVar103 * fVar103 * auVar9._4_4_ * -0.5;
        auVar15._0_4_ = fVar123 * fVar123 * fVar123 * auVar9._0_4_ * -0.5;
        auVar15._8_4_ = fVar104 * fVar104 * fVar104 * auVar9._8_4_ * -0.5;
        auVar15._12_4_ = fVar105 * fVar105 * fVar105 * auVar9._12_4_ * -0.5;
        auVar15._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar15._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar15._24_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar15._28_4_ = 0;
        auVar190._8_4_ = 0x3fc00000;
        auVar190._0_8_ = 0x3fc000003fc00000;
        auVar190._12_4_ = 0x3fc00000;
        auVar190._16_4_ = 0x3fc00000;
        auVar190._20_4_ = 0x3fc00000;
        auVar190._24_4_ = 0x3fc00000;
        auVar190._28_4_ = 0x3fc00000;
        auVar9 = vfmadd231ps_fma(auVar15,auVar190,auVar145);
        fVar123 = auVar9._0_4_;
        fVar103 = auVar9._4_4_;
        auVar16._4_4_ = auVar101._4_4_ * fVar103;
        auVar16._0_4_ = auVar101._0_4_ * fVar123;
        fVar104 = auVar9._8_4_;
        auVar16._8_4_ = auVar101._8_4_ * fVar104;
        fVar105 = auVar9._12_4_;
        auVar16._12_4_ = auVar101._12_4_ * fVar105;
        auVar16._16_4_ = auVar101._16_4_ * 0.0;
        auVar16._20_4_ = auVar101._20_4_ * 0.0;
        auVar16._24_4_ = auVar101._24_4_ * 0.0;
        auVar16._28_4_ = auVar145._28_4_;
        auVar26._4_4_ = -auVar102._4_4_ * fVar103;
        auVar26._0_4_ = -auVar102._0_4_ * fVar123;
        auVar26._8_4_ = -auVar102._8_4_ * fVar104;
        auVar26._12_4_ = -auVar102._12_4_ * fVar105;
        auVar26._16_4_ = -auVar102._16_4_ * 0.0;
        auVar26._20_4_ = -auVar102._20_4_ * 0.0;
        auVar26._24_4_ = -auVar102._24_4_ * 0.0;
        auVar26._28_4_ = 0x80000000;
        auVar9 = vfmadd213ps_fma(auVar133,auVar133,ZEXT832(0) << 0x20);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar113,auVar113);
        auVar145 = vrsqrtps_avx(ZEXT1632(auVar9));
        auVar27._28_4_ = auVar118._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar105 * 0.0,
                                CONCAT48(fVar104 * 0.0,CONCAT44(fVar103 * 0.0,fVar123 * 0.0))));
        fVar123 = auVar145._0_4_;
        fVar103 = auVar145._4_4_;
        fVar104 = auVar145._8_4_;
        fVar105 = auVar145._12_4_;
        fVar106 = auVar145._16_4_;
        fVar122 = auVar145._20_4_;
        fVar107 = auVar145._24_4_;
        auVar28._4_4_ = fVar103 * fVar103 * fVar103 * auVar9._4_4_ * -0.5;
        auVar28._0_4_ = fVar123 * fVar123 * fVar123 * auVar9._0_4_ * -0.5;
        auVar28._8_4_ = fVar104 * fVar104 * fVar104 * auVar9._8_4_ * -0.5;
        auVar28._12_4_ = fVar105 * fVar105 * fVar105 * auVar9._12_4_ * -0.5;
        auVar28._16_4_ = fVar106 * fVar106 * fVar106 * -0.0;
        auVar28._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar28._24_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar28._28_4_ = 0;
        auVar9 = vfmadd231ps_fma(auVar28,auVar190,auVar145);
        fVar123 = auVar9._0_4_;
        fVar103 = auVar9._4_4_;
        auVar29._4_4_ = auVar113._4_4_ * fVar103;
        auVar29._0_4_ = auVar113._0_4_ * fVar123;
        fVar104 = auVar9._8_4_;
        auVar29._8_4_ = auVar113._8_4_ * fVar104;
        fVar105 = auVar9._12_4_;
        auVar29._12_4_ = auVar113._12_4_ * fVar105;
        auVar29._16_4_ = auVar113._16_4_ * 0.0;
        auVar29._20_4_ = auVar113._20_4_ * 0.0;
        auVar29._24_4_ = auVar113._24_4_ * 0.0;
        auVar29._28_4_ = auVar113._28_4_;
        auVar30._4_4_ = fVar103 * -auVar133._4_4_;
        auVar30._0_4_ = fVar123 * -auVar133._0_4_;
        auVar30._8_4_ = fVar104 * -auVar133._8_4_;
        auVar30._12_4_ = fVar105 * -auVar133._12_4_;
        auVar30._16_4_ = -auVar133._16_4_ * 0.0;
        auVar30._20_4_ = -auVar133._20_4_ * 0.0;
        auVar30._24_4_ = -auVar133._24_4_ * 0.0;
        auVar30._28_4_ = auVar102._28_4_ ^ 0x80000000;
        auVar133._28_4_ = auVar145._28_4_;
        auVar133._0_28_ =
             ZEXT1628(CONCAT412(fVar105 * 0.0,
                                CONCAT48(fVar104 * 0.0,CONCAT44(fVar103 * 0.0,fVar123 * 0.0))));
        auVar13 = vfmadd213ps_fma(auVar16,ZEXT1632(auVar11),local_300);
        auVar113 = ZEXT1632(auVar11);
        auVar9 = vfmadd213ps_fma(auVar26,auVar113,_local_320);
        local_480 = ZEXT1632(auVar9);
        auVar90 = vfmadd213ps_fma(auVar27,auVar113,ZEXT1632(auVar14));
        local_520 = ZEXT1632(auVar90);
        auVar110 = vfnmadd213ps_fma(auVar16,auVar113,local_300);
        auVar89 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar12),auVar94);
        auVar144 = vfnmadd213ps_fma(auVar26,auVar113,_local_320);
        auVar113 = ZEXT1632(auVar12);
        auVar124 = vfmadd213ps_fma(auVar30,auVar113,local_2e0);
        local_7a0 = ZEXT1632(auVar11);
        auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_7a0,auVar27);
        auVar11 = vfmadd213ps_fma(auVar133,auVar113,ZEXT1632(auVar10));
        auVar87 = vfnmadd213ps_fma(auVar29,auVar113,auVar94);
        auVar109 = vfnmadd213ps_fma(auVar30,auVar113,local_2e0);
        local_460 = ZEXT1632(auVar12);
        auVar147 = vfnmadd231ps_fma(ZEXT1632(auVar10),local_460,auVar133);
        auVar133 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar144));
        auVar113 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar143));
        auVar94._4_4_ = auVar143._4_4_ * auVar133._4_4_;
        auVar94._0_4_ = auVar143._0_4_ * auVar133._0_4_;
        auVar94._8_4_ = auVar143._8_4_ * auVar133._8_4_;
        auVar94._12_4_ = auVar143._12_4_ * auVar133._12_4_;
        auVar94._16_4_ = auVar133._16_4_ * 0.0;
        auVar94._20_4_ = auVar133._20_4_ * 0.0;
        auVar94._24_4_ = auVar133._24_4_ * 0.0;
        auVar94._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar144),auVar113);
        auVar31._4_4_ = auVar110._4_4_ * auVar113._4_4_;
        auVar31._0_4_ = auVar110._0_4_ * auVar113._0_4_;
        auVar31._8_4_ = auVar110._8_4_ * auVar113._8_4_;
        auVar31._12_4_ = auVar110._12_4_ * auVar113._12_4_;
        auVar31._16_4_ = auVar113._16_4_ * 0.0;
        auVar31._20_4_ = auVar113._20_4_ * 0.0;
        auVar31._24_4_ = auVar113._24_4_ * 0.0;
        auVar31._28_4_ = auVar113._28_4_;
        auVar178 = ZEXT1632(auVar110);
        auVar113 = vsubps_avx(ZEXT1632(auVar89),auVar178);
        auVar14 = vfmsub231ps_fma(auVar31,ZEXT1632(auVar143),auVar113);
        auVar32._4_4_ = auVar144._4_4_ * auVar113._4_4_;
        auVar32._0_4_ = auVar144._0_4_ * auVar113._0_4_;
        auVar32._8_4_ = auVar144._8_4_ * auVar113._8_4_;
        auVar32._12_4_ = auVar144._12_4_ * auVar113._12_4_;
        auVar32._16_4_ = auVar113._16_4_ * 0.0;
        auVar32._20_4_ = auVar113._20_4_ * 0.0;
        auVar32._24_4_ = auVar113._24_4_ * 0.0;
        auVar32._28_4_ = auVar113._28_4_;
        auVar12 = vfmsub231ps_fma(auVar32,auVar178,auVar133);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar16 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
        auVar133 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar13),auVar16);
        auVar113 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar9),auVar16);
        auVar145 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar90),auVar16);
        auVar102 = vblendvps_avx(auVar178,ZEXT1632(auVar89),auVar16);
        auVar101 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar124),auVar16);
        auVar118 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar11),auVar16);
        auVar178 = vblendvps_avx(ZEXT1632(auVar89),auVar178,auVar16);
        auVar95 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar144),auVar16);
        auVar14 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar15 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar143),auVar16);
        auVar179 = vsubps_avx(auVar178,auVar133);
        auVar95 = vsubps_avx(auVar95,auVar113);
        auVar195 = vsubps_avx(auVar15,auVar145);
        auVar17 = vsubps_avx(auVar133,auVar102);
        auVar18 = vsubps_avx(auVar113,auVar101);
        auVar94 = vsubps_avx(auVar145,auVar118);
        auVar33._4_4_ = auVar195._4_4_ * auVar133._4_4_;
        auVar33._0_4_ = auVar195._0_4_ * auVar133._0_4_;
        auVar33._8_4_ = auVar195._8_4_ * auVar133._8_4_;
        auVar33._12_4_ = auVar195._12_4_ * auVar133._12_4_;
        auVar33._16_4_ = auVar195._16_4_ * auVar133._16_4_;
        auVar33._20_4_ = auVar195._20_4_ * auVar133._20_4_;
        auVar33._24_4_ = auVar195._24_4_ * auVar133._24_4_;
        auVar33._28_4_ = auVar15._28_4_;
        auVar9 = vfmsub231ps_fma(auVar33,auVar145,auVar179);
        auVar34._4_4_ = auVar179._4_4_ * auVar113._4_4_;
        auVar34._0_4_ = auVar179._0_4_ * auVar113._0_4_;
        auVar34._8_4_ = auVar179._8_4_ * auVar113._8_4_;
        auVar34._12_4_ = auVar179._12_4_ * auVar113._12_4_;
        auVar34._16_4_ = auVar179._16_4_ * auVar113._16_4_;
        auVar34._20_4_ = auVar179._20_4_ * auVar113._20_4_;
        auVar34._24_4_ = auVar179._24_4_ * auVar113._24_4_;
        auVar34._28_4_ = auVar178._28_4_;
        auVar10 = vfmsub231ps_fma(auVar34,auVar133,auVar95);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar98._0_4_ = auVar95._0_4_ * auVar145._0_4_;
        auVar98._4_4_ = auVar95._4_4_ * auVar145._4_4_;
        auVar98._8_4_ = auVar95._8_4_ * auVar145._8_4_;
        auVar98._12_4_ = auVar95._12_4_ * auVar145._12_4_;
        auVar98._16_4_ = auVar95._16_4_ * auVar145._16_4_;
        auVar98._20_4_ = auVar95._20_4_ * auVar145._20_4_;
        auVar98._24_4_ = auVar95._24_4_ * auVar145._24_4_;
        auVar98._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar98,auVar113,auVar195);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar135 = ZEXT1664(auVar10);
        auVar99._0_4_ = auVar94._0_4_ * auVar102._0_4_;
        auVar99._4_4_ = auVar94._4_4_ * auVar102._4_4_;
        auVar99._8_4_ = auVar94._8_4_ * auVar102._8_4_;
        auVar99._12_4_ = auVar94._12_4_ * auVar102._12_4_;
        auVar99._16_4_ = auVar94._16_4_ * auVar102._16_4_;
        auVar99._20_4_ = auVar94._20_4_ * auVar102._20_4_;
        auVar99._24_4_ = auVar94._24_4_ * auVar102._24_4_;
        auVar99._28_4_ = 0;
        auVar9 = vfmsub231ps_fma(auVar99,auVar17,auVar118);
        auVar35._4_4_ = auVar18._4_4_ * auVar118._4_4_;
        auVar35._0_4_ = auVar18._0_4_ * auVar118._0_4_;
        auVar35._8_4_ = auVar18._8_4_ * auVar118._8_4_;
        auVar35._12_4_ = auVar18._12_4_ * auVar118._12_4_;
        auVar35._16_4_ = auVar18._16_4_ * auVar118._16_4_;
        auVar35._20_4_ = auVar18._20_4_ * auVar118._20_4_;
        auVar35._24_4_ = auVar18._24_4_ * auVar118._24_4_;
        auVar35._28_4_ = auVar118._28_4_;
        auVar11 = vfmsub231ps_fma(auVar35,auVar101,auVar94);
        auVar36._4_4_ = auVar17._4_4_ * auVar101._4_4_;
        auVar36._0_4_ = auVar17._0_4_ * auVar101._0_4_;
        auVar36._8_4_ = auVar17._8_4_ * auVar101._8_4_;
        auVar36._12_4_ = auVar17._12_4_ * auVar101._12_4_;
        auVar36._16_4_ = auVar17._16_4_ * auVar101._16_4_;
        auVar36._20_4_ = auVar17._20_4_ * auVar101._20_4_;
        auVar36._24_4_ = auVar17._24_4_ * auVar101._24_4_;
        auVar36._28_4_ = auVar101._28_4_;
        auVar12 = vfmsub231ps_fma(auVar36,auVar18,auVar102);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar102 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
        auVar102 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,2);
        auVar9 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
        auVar14 = vpand_avx(auVar9,auVar14);
        auVar102 = vpmovsxwd_avx2(auVar14);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
LAB_015ed020:
          auVar160 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        }
        else {
          auVar37._4_4_ = auVar95._4_4_ * auVar94._4_4_;
          auVar37._0_4_ = auVar95._0_4_ * auVar94._0_4_;
          auVar37._8_4_ = auVar95._8_4_ * auVar94._8_4_;
          auVar37._12_4_ = auVar95._12_4_ * auVar94._12_4_;
          auVar37._16_4_ = auVar95._16_4_ * auVar94._16_4_;
          auVar37._20_4_ = auVar95._20_4_ * auVar94._20_4_;
          auVar37._24_4_ = auVar95._24_4_ * auVar94._24_4_;
          auVar37._28_4_ = auVar102._28_4_;
          auVar89 = vfmsub231ps_fma(auVar37,auVar18,auVar195);
          auVar116._0_4_ = auVar17._0_4_ * auVar195._0_4_;
          auVar116._4_4_ = auVar17._4_4_ * auVar195._4_4_;
          auVar116._8_4_ = auVar17._8_4_ * auVar195._8_4_;
          auVar116._12_4_ = auVar17._12_4_ * auVar195._12_4_;
          auVar116._16_4_ = auVar17._16_4_ * auVar195._16_4_;
          auVar116._20_4_ = auVar17._20_4_ * auVar195._20_4_;
          auVar116._24_4_ = auVar17._24_4_ * auVar195._24_4_;
          auVar116._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar116,auVar179,auVar94);
          auVar38._4_4_ = auVar179._4_4_ * auVar18._4_4_;
          auVar38._0_4_ = auVar179._0_4_ * auVar18._0_4_;
          auVar38._8_4_ = auVar179._8_4_ * auVar18._8_4_;
          auVar38._12_4_ = auVar179._12_4_ * auVar18._12_4_;
          auVar38._16_4_ = auVar179._16_4_ * auVar18._16_4_;
          auVar38._20_4_ = auVar179._20_4_ * auVar18._20_4_;
          auVar38._24_4_ = auVar179._24_4_ * auVar18._24_4_;
          auVar38._28_4_ = auVar179._28_4_;
          auVar124 = vfmsub231ps_fma(auVar38,auVar17,auVar95);
          auVar9 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar124));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar89),_DAT_01faff00);
          auVar102 = vrcpps_avx(ZEXT1632(auVar12));
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = 0x3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          auVar191._16_4_ = 0x3f800000;
          auVar191._20_4_ = 0x3f800000;
          auVar191._24_4_ = 0x3f800000;
          auVar191._28_4_ = 0x3f800000;
          auVar9 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar12),auVar191);
          auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar102,auVar102);
          auVar153._0_4_ = auVar145._0_4_ * auVar124._0_4_;
          auVar153._4_4_ = auVar145._4_4_ * auVar124._4_4_;
          auVar153._8_4_ = auVar145._8_4_ * auVar124._8_4_;
          auVar153._12_4_ = auVar145._12_4_ * auVar124._12_4_;
          auVar153._16_4_ = auVar145._16_4_ * 0.0;
          auVar153._20_4_ = auVar145._20_4_ * 0.0;
          auVar153._24_4_ = auVar145._24_4_ * 0.0;
          auVar153._28_4_ = 0;
          auVar90 = vfmadd231ps_fma(auVar153,auVar113,ZEXT1632(auVar90));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar89),auVar133);
          fVar103 = auVar9._0_4_;
          fVar104 = auVar9._4_4_;
          fVar105 = auVar9._8_4_;
          fVar106 = auVar9._12_4_;
          auVar102 = ZEXT1632(CONCAT412(fVar106 * auVar90._12_4_,
                                        CONCAT48(fVar105 * auVar90._8_4_,
                                                 CONCAT44(fVar104 * auVar90._4_4_,
                                                          fVar103 * auVar90._0_4_))));
          auVar9 = vpermilps_avx((undefined1  [16])aVar4,0xff);
          auVar100._0_8_ = auVar9._0_8_;
          auVar100._8_8_ = auVar100._0_8_;
          auVar100._16_8_ = auVar100._0_8_;
          auVar100._24_8_ = auVar100._0_8_;
          fVar123 = ray->tfar;
          auVar117._4_4_ = fVar123;
          auVar117._0_4_ = fVar123;
          auVar117._8_4_ = fVar123;
          auVar117._12_4_ = fVar123;
          auVar117._16_4_ = fVar123;
          auVar117._20_4_ = fVar123;
          auVar117._24_4_ = fVar123;
          auVar117._28_4_ = fVar123;
          auVar113 = vcmpps_avx(auVar100,auVar102,2);
          auVar145 = vcmpps_avx(auVar102,auVar117,2);
          auVar113 = vandps_avx(auVar145,auVar113);
          auVar9 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
          auVar14 = vpand_avx(auVar14,auVar9);
          auVar113 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) goto LAB_015ed020;
          auVar113 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,4);
          auVar9 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
          auVar14 = vpand_avx(auVar14,auVar9);
          auVar113 = vpmovsxwd_avx2(auVar14);
          auVar160 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0x7f,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0xbf,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar113[0x1f] < '\0') {
            auVar101 = ZEXT1632(CONCAT412(fVar106 * auVar10._12_4_,
                                          CONCAT48(fVar105 * auVar10._8_4_,
                                                   CONCAT44(fVar104 * auVar10._4_4_,
                                                            fVar103 * auVar10._0_4_))));
            auVar118 = ZEXT1632(CONCAT412(fVar106 * auVar11._12_4_,
                                          CONCAT48(fVar105 * auVar11._8_4_,
                                                   CONCAT44(fVar104 * auVar11._4_4_,
                                                            fVar103 * auVar11._0_4_))));
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar146._16_4_ = 0x3f800000;
            auVar146._20_4_ = 0x3f800000;
            auVar146._24_4_ = 0x3f800000;
            auVar146._28_4_ = 0x3f800000;
            auVar145 = vsubps_avx(auVar146,auVar101);
            auVar135 = ZEXT3264(auVar145);
            local_4c0 = vblendvps_avx(auVar145,auVar101,auVar16);
            auVar145 = vsubps_avx(auVar146,auVar118);
            local_360 = vblendvps_avx(auVar145,auVar118,auVar16);
            auVar160 = ZEXT3264(auVar113);
            local_4e0 = auVar102;
          }
        }
        auVar204 = ZEXT3264(local_700);
        auVar203 = ZEXT3264(local_6e0);
        auVar198 = ZEXT3264(local_740);
        auVar183 = ZEXT3264(local_720);
        auVar113 = auVar160._0_32_;
        fVar123 = fVar188;
        fVar103 = fVar192;
        fVar104 = fVar188;
        fVar105 = fVar192;
        fVar106 = fVar188;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar160 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar160 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar160[0x1f]) {
          bVar85 = false;
          goto LAB_015ebe12;
        }
        auVar145 = vsubps_avx(local_460,local_7a0);
        auVar14 = vfmadd213ps_fma(auVar145,local_4c0,local_7a0);
        fVar122 = local_6a8->depth_scale;
        auVar39._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar122;
        auVar39._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar122;
        auVar39._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar122;
        auVar39._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar122;
        auVar39._16_4_ = fVar122 * 0.0;
        auVar39._20_4_ = fVar122 * 0.0;
        auVar39._24_4_ = fVar122 * 0.0;
        auVar39._28_4_ = 0;
        auVar145 = vcmpps_avx(local_4e0,auVar39,6);
        auVar102 = auVar113 & auVar145;
        auVar160 = ZEXT3264(CONCAT428(local_680,
                                      CONCAT424(local_680,
                                                CONCAT420(local_680,
                                                          CONCAT416(local_680,
                                                                    CONCAT412(local_680,
                                                                              CONCAT48(local_680,
                                                                                       CONCAT44(
                                                  local_680,local_680))))))));
        auVar166 = ZEXT3264(local_6a0);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          auVar119._8_4_ = 0xbf800000;
          auVar119._0_8_ = 0xbf800000bf800000;
          auVar119._12_4_ = 0xbf800000;
          auVar119._16_4_ = 0xbf800000;
          auVar119._20_4_ = 0xbf800000;
          auVar119._24_4_ = 0xbf800000;
          auVar119._28_4_ = 0xbf800000;
          auVar131._8_4_ = 0x40000000;
          auVar131._0_8_ = 0x4000000040000000;
          auVar131._12_4_ = 0x40000000;
          auVar131._16_4_ = 0x40000000;
          auVar131._20_4_ = 0x40000000;
          auVar131._24_4_ = 0x40000000;
          auVar131._28_4_ = 0x40000000;
          auVar135 = ZEXT3264(auVar131);
          auVar14 = vfmadd213ps_fma(local_360,auVar131,auVar119);
          local_240 = local_4c0;
          local_360 = ZEXT1632(auVar14);
          auVar102 = local_360;
          local_220 = ZEXT1632(auVar14);
          local_200 = local_4e0;
          local_1e0 = 0;
          local_1dc = iVar7;
          local_1d0 = local_530._0_8_;
          uStack_1c8 = local_530._8_8_;
          local_1c0 = local_5b0._0_8_;
          uStack_1b8 = local_5b0._8_8_;
          local_1b0 = local_5c0._0_8_;
          uStack_1a8 = local_5c0._8_8_;
          if ((pGVar84->mask & ray->mask) != 0) {
            auVar121 = ZEXT3264(local_780);
            auVar142 = ZEXT3264(local_5e0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar85 = true, local_5c0 = auVar88, local_5b0 = auVar111, local_530 = auVar136,
               pGVar84->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar113 = vandps_avx(auVar145,auVar113);
              fVar122 = 1.0 / auVar96._0_4_;
              auVar135 = ZEXT3264(CONCAT428(fVar122,CONCAT424(fVar122,CONCAT420(fVar122,CONCAT416(
                                                  fVar122,CONCAT412(fVar122,CONCAT48(fVar122,
                                                  CONCAT44(fVar122,fVar122))))))));
              local_160[0] = fVar122 * (local_4c0._0_4_ + 0.0);
              local_160[1] = fVar122 * (local_4c0._4_4_ + 1.0);
              local_160[2] = fVar122 * (local_4c0._8_4_ + 2.0);
              local_160[3] = fVar122 * (local_4c0._12_4_ + 3.0);
              fStack_150 = fVar122 * (local_4c0._16_4_ + 4.0);
              fStack_14c = fVar122 * (local_4c0._20_4_ + 5.0);
              fStack_148 = fVar122 * (local_4c0._24_4_ + 6.0);
              fStack_144 = local_4c0._28_4_ + 7.0;
              local_360._0_8_ = auVar14._0_8_;
              local_360._8_8_ = auVar14._8_8_;
              local_140 = local_360._0_8_;
              uStack_138 = local_360._8_8_;
              uStack_130 = 0;
              uStack_128 = 0;
              local_120 = local_4e0;
              uVar82 = vmovmskps_avx(auVar113);
              local_360 = auVar102;
              if (uVar82 == 0) goto LAB_015ebef3;
              uVar79 = CONCAT44(0,uVar82 & 0xff);
              local_7c0._8_24_ = auVar133._8_24_;
              local_7c0._0_8_ = uVar79;
              lVar80 = 0;
              for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                lVar80 = lVar80 + 1;
              }
              local_600 = ZEXT1632(CONCAT124(auVar13._4_12_,ray->tfar));
              local_5c0 = auVar88;
              local_5b0 = auVar111;
              local_530 = auVar136;
              _local_3e0 = auVar114;
              do {
                local_594 = local_160[lVar80];
                local_590 = *(undefined4 *)((long)&local_140 + lVar80 * 4);
                local_7a0._0_8_ = lVar80;
                ray->tfar = *(float *)(local_120 + lVar80 * 4);
                local_630.context = context->user;
                fVar103 = 1.0 - local_594;
                fVar123 = fVar103 * fVar103 * -3.0;
                auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * fVar103)),
                                          ZEXT416((uint)(local_594 * fVar103)),ZEXT416(0xc0000000));
                auVar9 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar103)),
                                         ZEXT416((uint)(local_594 * local_594)),ZEXT416(0x40000000))
                ;
                fVar103 = auVar14._0_4_ * 3.0;
                fVar104 = auVar9._0_4_ * 3.0;
                fVar105 = local_594 * local_594 * 3.0;
                auVar151._0_4_ = fVar105 * (float)local_410._0_4_;
                auVar151._4_4_ = fVar105 * (float)local_410._4_4_;
                auVar151._8_4_ = fVar105 * fStack_408;
                auVar151._12_4_ = fVar105 * fStack_404;
                auVar126._4_4_ = fVar104;
                auVar126._0_4_ = fVar104;
                auVar126._8_4_ = fVar104;
                auVar126._12_4_ = fVar104;
                auVar14 = vfmadd132ps_fma(auVar126,auVar151,local_5c0);
                auVar138._4_4_ = fVar103;
                auVar138._0_4_ = fVar103;
                auVar138._8_4_ = fVar103;
                auVar138._12_4_ = fVar103;
                auVar14 = vfmadd132ps_fma(auVar138,auVar14,local_5b0);
                auVar127._4_4_ = fVar123;
                auVar127._0_4_ = fVar123;
                auVar127._8_4_ = fVar123;
                auVar127._12_4_ = fVar123;
                auVar14 = vfmadd132ps_fma(auVar127,auVar14,local_530);
                auVar135 = ZEXT1664(auVar14);
                local_5a0 = vmovlps_avx(auVar14);
                local_598 = vextractps_avx(auVar14,2);
                local_58c = (int)local_568;
                local_588 = (int)local_6b0;
                local_584 = (local_630.context)->instID[0];
                local_580 = (local_630.context)->instPrimID[0];
                local_7cc = -1;
                local_630.valid = &local_7cc;
                local_630.geometryUserPtr = pGVar84->userPtr;
                local_630.ray = (RTCRayN *)ray;
                local_630.hit = (RTCHitN *)&local_5a0;
                local_630.N = 1;
                if (pGVar84->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015ec1c5:
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar84->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar135 = ZEXT1664(auVar135._0_16_);
                    (*p_Var8)(&local_630);
                    if (*local_630.valid == 0) goto LAB_015ec209;
                  }
                  bVar85 = true;
                  goto LAB_015eb7f6;
                }
                auVar135 = ZEXT1664(auVar14);
                (*pGVar84->occlusionFilterN)(&local_630);
                if (*local_630.valid != 0) goto LAB_015ec1c5;
LAB_015ec209:
                ray->tfar = (float)local_600._0_4_;
                uVar81 = local_7c0._0_8_ ^ 1L << (local_7a0._0_8_ & 0x3f);
                bVar85 = false;
                local_7c0._0_8_ = uVar81;
                lVar80 = 0;
                for (uVar79 = uVar81; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000)
                {
                  lVar80 = lVar80 + 1;
                }
                auVar183 = ZEXT3264(local_720);
                auVar198 = ZEXT3264(local_740);
                auVar121 = ZEXT3264(local_780);
                auVar203 = ZEXT3264(local_6e0);
                auVar204 = ZEXT3264(local_700);
                auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                              CONCAT424(fStack_668,
                                                        CONCAT420(fStack_66c,
                                                                  CONCAT416(fStack_670,
                                                                            CONCAT412(fStack_674,
                                                                                      CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
                auVar166 = ZEXT3264(local_6a0);
                auVar142 = ZEXT3264(local_5e0);
                fVar188 = (float)local_660;
                fVar192 = local_660._4_4_;
                fVar123 = (float)uStack_658;
                fVar103 = uStack_658._4_4_;
                fVar104 = (float)uStack_650;
                fVar105 = uStack_650._4_4_;
                fVar106 = (float)uStack_648;
              } while (uVar81 != 0);
            }
            goto LAB_015ebe2d;
          }
          bVar85 = false;
          local_5c0 = auVar88;
          local_5b0 = auVar111;
          local_530 = auVar136;
          goto LAB_015ebe24;
        }
LAB_015ebef3:
        auVar142 = ZEXT3264(local_5e0);
        bVar85 = false;
        auVar121 = ZEXT3264(local_780);
        local_5c0 = auVar88;
        local_5b0 = auVar111;
        local_530 = auVar136;
      }
LAB_015ebe2d:
      local_720 = auVar183._0_32_;
      local_740 = auVar198._0_32_;
      local_7c0._0_8_ = context;
      if (8 < iVar7) {
        local_520._4_4_ = iVar7;
        local_520._0_4_ = iVar7;
        local_520._8_4_ = iVar7;
        local_520._12_4_ = iVar7;
        local_520._16_4_ = iVar7;
        local_520._20_4_ = iVar7;
        local_520._24_4_ = iVar7;
        local_520._28_4_ = iVar7;
        local_c0 = local_760._0_4_;
        uStack_bc = local_760._0_4_;
        uStack_b8 = local_760._0_4_;
        uStack_b4 = local_760._0_4_;
        uStack_b0 = local_760._0_4_;
        uStack_ac = local_760._0_4_;
        uStack_a8 = local_760._0_4_;
        uStack_a4 = local_760._0_4_;
        auVar14 = vpermilps_avx(local_560._0_16_,0xff);
        local_e0 = auVar14._0_8_;
        uStack_d8 = local_e0;
        uStack_d0 = local_e0;
        uStack_c8 = local_e0;
        local_100 = 1.0 / (float)local_400._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        lVar80 = 8;
        do {
          auVar195 = auVar198._0_32_;
          auVar179 = auVar183._0_32_;
          auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 * 4 + lVar19);
          local_760 = *(undefined1 (*) [32])(lVar19 + 0x21aa768 + lVar80 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar19 + 0x21aabec + lVar80 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar19 + 0x21ab070 + lVar80 * 4);
          fVar168 = *(float *)*pauVar1;
          fVar170 = *(float *)(*pauVar1 + 4);
          fVar172 = *(float *)(*pauVar1 + 8);
          fVar184 = *(float *)(*pauVar1 + 0xc);
          fVar185 = *(float *)(*pauVar1 + 0x10);
          fVar71 = *(float *)(*pauVar1 + 0x14);
          fVar72 = *(float *)(*pauVar1 + 0x18);
          auVar76 = *(undefined1 (*) [28])*pauVar1;
          auVar199._0_4_ = fVar168 * auVar160._0_4_;
          auVar199._4_4_ = fVar170 * auVar160._4_4_;
          auVar199._8_4_ = fVar172 * auVar160._8_4_;
          auVar199._12_4_ = fVar184 * auVar160._12_4_;
          auVar199._16_4_ = fVar185 * auVar160._16_4_;
          auVar199._20_4_ = fVar71 * auVar160._20_4_;
          auVar199._28_36_ = auVar198._28_36_;
          auVar199._24_4_ = fVar72 * auVar160._24_4_;
          auVar183._0_4_ = fVar168 * fVar188;
          auVar183._4_4_ = fVar170 * fVar192;
          auVar183._8_4_ = fVar172 * fVar123;
          auVar183._12_4_ = fVar184 * fVar103;
          auVar183._16_4_ = fVar185 * fVar104;
          auVar183._20_4_ = fVar71 * fVar105;
          auVar183._28_36_ = auVar135._28_36_;
          auVar183._24_4_ = fVar72 * fVar106;
          auVar14 = vfmadd231ps_fma(auVar199._0_32_,auVar113,auVar204._0_32_);
          auVar9 = vfmadd231ps_fma(auVar183._0_32_,auVar113,auVar203._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_760,auVar166._0_32_);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_760,auVar121._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar133,auVar142._0_32_);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar133,local_440);
          auVar145 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 * 4 + lVar19);
          auVar102 = *(undefined1 (*) [32])(lVar19 + 0x21acb88 + lVar80 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar19 + 0x21ad00c + lVar80 * 4);
          pfVar2 = (float *)(lVar19 + 0x21ad490 + lVar80 * 4);
          fVar73 = *pfVar2;
          fVar161 = pfVar2[1];
          fVar167 = pfVar2[2];
          fVar169 = pfVar2[3];
          fVar171 = pfVar2[4];
          fVar173 = pfVar2[5];
          fVar174 = pfVar2[6];
          auVar40._4_4_ = fVar161 * auVar160._4_4_;
          auVar40._0_4_ = fVar73 * auVar160._0_4_;
          auVar40._8_4_ = fVar167 * auVar160._8_4_;
          auVar40._12_4_ = fVar169 * auVar160._12_4_;
          auVar40._16_4_ = fVar171 * auVar160._16_4_;
          auVar40._20_4_ = fVar173 * auVar160._20_4_;
          auVar40._24_4_ = fVar174 * auVar160._24_4_;
          auVar40._28_4_ = local_760._28_4_;
          auVar198._0_4_ = fVar73 * fVar188;
          auVar198._4_4_ = fVar161 * fVar192;
          auVar198._8_4_ = fVar167 * fVar123;
          auVar198._12_4_ = fVar169 * fVar103;
          auVar198._16_4_ = fVar171 * fVar104;
          auVar198._20_4_ = fVar173 * fVar105;
          auVar198._28_36_ = auVar160._28_36_;
          auVar198._24_4_ = fVar174 * fVar106;
          auVar10 = vfmadd231ps_fma(auVar40,auVar101,auVar204._0_32_);
          auVar11 = vfmadd231ps_fma(auVar198._0_32_,auVar101,auVar203._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar102,auVar166._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar102,auVar121._0_32_);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar145,auVar142._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar145,local_440);
          local_2e0 = ZEXT1632(auVar10);
          local_300 = ZEXT1632(auVar14);
          auVar178 = vsubps_avx(local_2e0,local_300);
          local_460 = ZEXT1632(auVar11);
          local_560._0_32_ = ZEXT1632(auVar9);
          local_480 = vsubps_avx(local_460,local_560._0_32_);
          auVar41._4_4_ = auVar9._4_4_ * auVar178._4_4_;
          auVar41._0_4_ = auVar9._0_4_ * auVar178._0_4_;
          auVar41._8_4_ = auVar9._8_4_ * auVar178._8_4_;
          auVar41._12_4_ = auVar9._12_4_ * auVar178._12_4_;
          auVar41._16_4_ = auVar178._16_4_ * 0.0;
          auVar41._20_4_ = auVar178._20_4_ * 0.0;
          auVar41._24_4_ = auVar178._24_4_ * 0.0;
          auVar41._28_4_ = auVar145._28_4_;
          fVar123 = local_480._0_4_;
          auVar135._0_4_ = auVar14._0_4_ * fVar123;
          fVar103 = local_480._4_4_;
          auVar135._4_4_ = auVar14._4_4_ * fVar103;
          fVar104 = local_480._8_4_;
          auVar135._8_4_ = auVar14._8_4_ * fVar104;
          fVar105 = local_480._12_4_;
          auVar135._12_4_ = auVar14._12_4_ * fVar105;
          fVar106 = local_480._16_4_;
          auVar135._16_4_ = fVar106 * 0.0;
          fVar122 = local_480._20_4_;
          auVar135._20_4_ = fVar122 * 0.0;
          fVar107 = local_480._24_4_;
          auVar135._28_36_ = auVar121._28_36_;
          auVar135._24_4_ = fVar107 * 0.0;
          auVar95 = vsubps_avx(auVar41,auVar135._0_32_);
          _local_320 = *pauVar1;
          auVar16 = _local_320;
          auVar132._0_4_ = fVar168 * (float)local_280._0_4_;
          auVar132._4_4_ = fVar170 * (float)local_280._4_4_;
          auVar132._8_4_ = fVar172 * fStack_278;
          auVar132._12_4_ = fVar184 * fStack_274;
          auVar132._16_4_ = fVar185 * fStack_270;
          auVar132._20_4_ = fVar71 * fStack_26c;
          auVar132._24_4_ = fVar72 * fStack_268;
          auVar132._28_4_ = 0;
          auVar14 = vfmadd231ps_fma(auVar132,local_a0,auVar113);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,local_760);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_260,auVar133);
          auVar135 = ZEXT1664(auVar14);
          auVar42._4_4_ = fVar161 * (float)local_280._4_4_;
          auVar42._0_4_ = fVar73 * (float)local_280._0_4_;
          auVar42._8_4_ = fVar167 * fStack_278;
          auVar42._12_4_ = fVar169 * fStack_274;
          auVar42._16_4_ = fVar171 * fStack_270;
          auVar42._20_4_ = fVar173 * fStack_26c;
          auVar42._24_4_ = fVar174 * fStack_268;
          auVar42._28_4_ = uStack_264;
          auVar9 = vfmadd231ps_fma(auVar42,auVar101,local_a0);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar102,local_80);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar145,local_260);
          auVar43._4_4_ = fVar103 * fVar103;
          auVar43._0_4_ = fVar123 * fVar123;
          auVar43._8_4_ = fVar104 * fVar104;
          auVar43._12_4_ = fVar105 * fVar105;
          auVar43._16_4_ = fVar106 * fVar106;
          auVar43._20_4_ = fVar122 * fVar122;
          auVar43._24_4_ = fVar107 * fVar107;
          auVar43._28_4_ = local_260._28_4_;
          auVar10 = vfmadd231ps_fma(auVar43,auVar178,auVar178);
          _local_3e0 = ZEXT1632(auVar9);
          auVar118 = vmaxps_avx(ZEXT1632(auVar14),_local_3e0);
          auVar180._0_4_ = auVar118._0_4_ * auVar118._0_4_ * auVar10._0_4_;
          auVar180._4_4_ = auVar118._4_4_ * auVar118._4_4_ * auVar10._4_4_;
          auVar180._8_4_ = auVar118._8_4_ * auVar118._8_4_ * auVar10._8_4_;
          auVar180._12_4_ = auVar118._12_4_ * auVar118._12_4_ * auVar10._12_4_;
          auVar180._16_4_ = auVar118._16_4_ * auVar118._16_4_ * 0.0;
          auVar180._20_4_ = auVar118._20_4_ * auVar118._20_4_ * 0.0;
          auVar180._24_4_ = auVar118._24_4_ * auVar118._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar44._4_4_ = auVar95._4_4_ * auVar95._4_4_;
          auVar44._0_4_ = auVar95._0_4_ * auVar95._0_4_;
          auVar44._8_4_ = auVar95._8_4_ * auVar95._8_4_;
          auVar44._12_4_ = auVar95._12_4_ * auVar95._12_4_;
          auVar44._16_4_ = auVar95._16_4_ * auVar95._16_4_;
          auVar44._20_4_ = auVar95._20_4_ * auVar95._20_4_;
          auVar44._24_4_ = auVar95._24_4_ * auVar95._24_4_;
          auVar44._28_4_ = auVar95._28_4_;
          auVar118 = vcmpps_avx(auVar44,auVar180,2);
          local_1e0 = (int)lVar80;
          auVar181._4_4_ = local_1e0;
          auVar181._0_4_ = local_1e0;
          auVar181._8_4_ = local_1e0;
          auVar181._12_4_ = local_1e0;
          auVar181._16_4_ = local_1e0;
          auVar181._20_4_ = local_1e0;
          auVar181._24_4_ = local_1e0;
          auVar181._28_4_ = local_1e0;
          auVar95 = vpor_avx2(auVar181,_DAT_01fe9900);
          auVar15 = vpcmpgtd_avx2(local_520,auVar95);
          auVar95 = auVar15 & auVar118;
          local_7c0._0_8_ = context;
          fVar188 = (float)local_660;
          fVar192 = local_660._4_4_;
          fVar123 = (float)uStack_658;
          fVar103 = uStack_658._4_4_;
          fVar104 = (float)uStack_650;
          fVar105 = uStack_650._4_4_;
          fVar106 = (float)uStack_648;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
            auVar183 = ZEXT3264(auVar179);
            auVar198 = ZEXT3264(auVar195);
LAB_015ecafb:
            auVar204 = ZEXT3264(local_700);
            auVar203 = ZEXT3264(local_6e0);
            auVar121 = ZEXT3264(local_780);
            auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                          CONCAT424(fStack_668,
                                                    CONCAT420(fStack_66c,
                                                              CONCAT416(fStack_670,
                                                                        CONCAT412(fStack_674,
                                                                                  CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
            auVar166 = ZEXT3264(local_6a0);
          }
          else {
            local_400 = vandps_avx(auVar15,auVar118);
            auVar45._4_4_ = fVar161 * local_2c0._4_4_;
            auVar45._0_4_ = fVar73 * (float)local_2c0;
            auVar45._8_4_ = fVar167 * (float)uStack_2b8;
            auVar45._12_4_ = fVar169 * uStack_2b8._4_4_;
            auVar45._16_4_ = fVar171 * (float)uStack_2b0;
            auVar45._20_4_ = fVar173 * uStack_2b0._4_4_;
            auVar45._24_4_ = fVar174 * (float)uStack_2a8;
            auVar45._28_4_ = auVar118._28_4_;
            auVar9 = vfmadd213ps_fma(auVar101,local_3a0,auVar45);
            auVar9 = vfmadd213ps_fma(auVar102,local_3c0,ZEXT1632(auVar9));
            auVar9 = vfmadd132ps_fma(auVar145,ZEXT1632(auVar9),local_500);
            local_340 = ZEXT1632(auVar9);
            local_320._0_4_ = auVar76._0_4_;
            local_320._4_4_ = auVar76._4_4_;
            fStack_318 = auVar76._8_4_;
            fStack_314 = auVar76._12_4_;
            fStack_310 = auVar76._16_4_;
            fStack_30c = auVar76._20_4_;
            fStack_308 = auVar76._24_4_;
            auVar46._4_4_ = local_2c0._4_4_ * (float)local_320._4_4_;
            auVar46._0_4_ = (float)local_2c0 * (float)local_320._0_4_;
            auVar46._8_4_ = (float)uStack_2b8 * fStack_318;
            auVar46._12_4_ = uStack_2b8._4_4_ * fStack_314;
            auVar46._16_4_ = (float)uStack_2b0 * fStack_310;
            auVar46._20_4_ = uStack_2b0._4_4_ * fStack_30c;
            auVar46._24_4_ = (float)uStack_2a8 * fStack_308;
            auVar46._28_4_ = auVar118._28_4_;
            auVar9 = vfmadd213ps_fma(auVar113,local_3a0,auVar46);
            auVar9 = vfmadd213ps_fma(local_760,local_3c0,ZEXT1632(auVar9));
            auVar113 = *(undefined1 (*) [32])(lVar19 + 0x21ab4f4 + lVar80 * 4);
            auVar145 = *(undefined1 (*) [32])(lVar19 + 0x21ab978 + lVar80 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar19 + 0x21abdfc + lVar80 * 4);
            pfVar3 = (float *)(lVar19 + 0x21ac280 + lVar80 * 4);
            fVar122 = *pfVar3;
            fVar107 = pfVar3[1];
            fVar168 = pfVar3[2];
            fVar170 = pfVar3[3];
            fVar172 = pfVar3[4];
            fVar184 = pfVar3[5];
            fVar185 = pfVar3[6];
            auVar47._4_4_ = fStack_67c * fVar107;
            auVar47._0_4_ = local_680 * fVar122;
            auVar47._8_4_ = fStack_678 * fVar168;
            auVar47._12_4_ = fStack_674 * fVar170;
            auVar47._16_4_ = fStack_670 * fVar172;
            auVar47._20_4_ = fStack_66c * fVar184;
            auVar47._24_4_ = fStack_668 * fVar185;
            auVar47._28_4_ = pfVar2[7];
            auVar196._0_4_ = (float)local_660 * fVar122;
            auVar196._4_4_ = local_660._4_4_ * fVar107;
            auVar196._8_4_ = (float)uStack_658 * fVar168;
            auVar196._12_4_ = uStack_658._4_4_ * fVar170;
            auVar196._16_4_ = (float)uStack_650 * fVar172;
            auVar196._20_4_ = uStack_650._4_4_ * fVar184;
            auVar196._24_4_ = (float)uStack_648 * fVar185;
            auVar196._28_4_ = 0;
            auVar48._4_4_ = fVar107 * local_2c0._4_4_;
            auVar48._0_4_ = fVar122 * (float)local_2c0;
            auVar48._8_4_ = fVar168 * (float)uStack_2b8;
            auVar48._12_4_ = fVar170 * uStack_2b8._4_4_;
            auVar48._16_4_ = fVar172 * (float)uStack_2b0;
            auVar48._20_4_ = fVar184 * uStack_2b0._4_4_;
            auVar48._24_4_ = fVar185 * (float)uStack_2a8;
            auVar48._28_4_ = pfVar3[7];
            auVar10 = vfmadd231ps_fma(auVar47,auVar102,local_700);
            auVar11 = vfmadd231ps_fma(auVar196,auVar102,local_6e0);
            auVar12 = vfmadd231ps_fma(auVar48,local_3a0,auVar102);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar145,local_6a0);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar145,local_780);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_3c0,auVar145);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar113,local_5e0);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar113,local_440);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar113,local_500);
            pfVar2 = (float *)(lVar19 + 0x21ae6a0 + lVar80 * 4);
            fVar122 = *pfVar2;
            fVar107 = pfVar2[1];
            fVar168 = pfVar2[2];
            fVar170 = pfVar2[3];
            fVar172 = pfVar2[4];
            fVar184 = pfVar2[5];
            fVar185 = pfVar2[6];
            auVar49._4_4_ = fStack_67c * fVar107;
            auVar49._0_4_ = local_680 * fVar122;
            auVar49._8_4_ = fStack_678 * fVar168;
            auVar49._12_4_ = fStack_674 * fVar170;
            auVar49._16_4_ = fStack_670 * fVar172;
            auVar49._20_4_ = fStack_66c * fVar184;
            auVar49._24_4_ = fStack_668 * fVar185;
            auVar49._28_4_ = fStack_664;
            auVar50._4_4_ = local_660._4_4_ * fVar107;
            auVar50._0_4_ = (float)local_660 * fVar122;
            auVar50._8_4_ = (float)uStack_658 * fVar168;
            auVar50._12_4_ = uStack_658._4_4_ * fVar170;
            auVar50._16_4_ = (float)uStack_650 * fVar172;
            auVar50._20_4_ = uStack_650._4_4_ * fVar184;
            auVar50._24_4_ = (float)uStack_648 * fVar185;
            auVar50._28_4_ = uStack_648._4_4_;
            auVar51._4_4_ = local_2c0._4_4_ * fVar107;
            auVar51._0_4_ = (float)local_2c0 * fVar122;
            auVar51._8_4_ = (float)uStack_2b8 * fVar168;
            auVar51._12_4_ = uStack_2b8._4_4_ * fVar170;
            auVar51._16_4_ = (float)uStack_2b0 * fVar172;
            auVar51._20_4_ = uStack_2b0._4_4_ * fVar184;
            auVar51._24_4_ = (float)uStack_2a8 * fVar185;
            auVar51._28_4_ = pfVar2[7];
            auVar113 = *(undefined1 (*) [32])(lVar19 + 0x21ae21c + lVar80 * 4);
            auVar13 = vfmadd231ps_fma(auVar49,auVar113,local_700);
            auVar90 = vfmadd231ps_fma(auVar50,auVar113,local_6e0);
            auVar89 = vfmadd231ps_fma(auVar51,local_3a0,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar19 + 0x21add98 + lVar80 * 4);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar113,local_6a0);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,local_780);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_3c0,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar19 + 0x21ad914 + lVar80 * 4);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar113,local_5e0);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar113,local_440);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_500,auVar113);
            auVar182._8_4_ = 0x7fffffff;
            auVar182._0_8_ = 0x7fffffff7fffffff;
            auVar182._12_4_ = 0x7fffffff;
            auVar182._16_4_ = 0x7fffffff;
            auVar182._20_4_ = 0x7fffffff;
            auVar182._24_4_ = 0x7fffffff;
            auVar182._28_4_ = 0x7fffffff;
            auVar113 = vandps_avx(ZEXT1632(auVar10),auVar182);
            auVar145 = vandps_avx(ZEXT1632(auVar11),auVar182);
            auVar145 = vmaxps_avx(auVar113,auVar145);
            auVar113 = vandps_avx(ZEXT1632(auVar12),auVar182);
            auVar113 = vmaxps_avx(auVar145,auVar113);
            auVar75._4_4_ = uStack_bc;
            auVar75._0_4_ = local_c0;
            auVar75._8_4_ = uStack_b8;
            auVar75._12_4_ = uStack_b4;
            auVar75._16_4_ = uStack_b0;
            auVar75._20_4_ = uStack_ac;
            auVar75._24_4_ = uStack_a8;
            auVar75._28_4_ = uStack_a4;
            auVar113 = vcmpps_avx(auVar113,auVar75,1);
            auVar102 = vblendvps_avx(ZEXT1632(auVar10),auVar178,auVar113);
            auVar101 = vblendvps_avx(ZEXT1632(auVar11),local_480,auVar113);
            auVar113 = vandps_avx(ZEXT1632(auVar13),auVar182);
            auVar145 = vandps_avx(ZEXT1632(auVar90),auVar182);
            auVar145 = vmaxps_avx(auVar113,auVar145);
            auVar113 = vandps_avx(auVar182,ZEXT1632(auVar89));
            auVar113 = vmaxps_avx(auVar145,auVar113);
            auVar145 = vcmpps_avx(auVar113,auVar75,1);
            auVar113 = vblendvps_avx(ZEXT1632(auVar13),auVar178,auVar145);
            auVar145 = vblendvps_avx(ZEXT1632(auVar90),local_480,auVar145);
            auVar9 = vfmadd213ps_fma(auVar133,local_500,ZEXT1632(auVar9));
            auVar10 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar101,auVar101);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar10));
            fVar122 = auVar133._0_4_;
            fVar107 = auVar133._4_4_;
            fVar168 = auVar133._8_4_;
            fVar170 = auVar133._12_4_;
            fVar172 = auVar133._16_4_;
            fVar184 = auVar133._20_4_;
            fVar185 = auVar133._24_4_;
            auVar52._4_4_ = fVar107 * fVar107 * fVar107 * auVar10._4_4_ * -0.5;
            auVar52._0_4_ = fVar122 * fVar122 * fVar122 * auVar10._0_4_ * -0.5;
            auVar52._8_4_ = fVar168 * fVar168 * fVar168 * auVar10._8_4_ * -0.5;
            auVar52._12_4_ = fVar170 * fVar170 * fVar170 * auVar10._12_4_ * -0.5;
            auVar52._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar52._20_4_ = fVar184 * fVar184 * fVar184 * -0.0;
            auVar52._24_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar52._28_4_ = 0;
            auVar202._8_4_ = 0x3fc00000;
            auVar202._0_8_ = 0x3fc000003fc00000;
            auVar202._12_4_ = 0x3fc00000;
            auVar202._16_4_ = 0x3fc00000;
            auVar202._20_4_ = 0x3fc00000;
            auVar202._24_4_ = 0x3fc00000;
            auVar202._28_4_ = 0x3fc00000;
            auVar10 = vfmadd231ps_fma(auVar52,auVar202,auVar133);
            fVar122 = auVar10._0_4_;
            fVar107 = auVar10._4_4_;
            auVar53._4_4_ = auVar101._4_4_ * fVar107;
            auVar53._0_4_ = auVar101._0_4_ * fVar122;
            fVar168 = auVar10._8_4_;
            auVar53._8_4_ = auVar101._8_4_ * fVar168;
            fVar170 = auVar10._12_4_;
            auVar53._12_4_ = auVar101._12_4_ * fVar170;
            auVar53._16_4_ = auVar101._16_4_ * 0.0;
            auVar53._20_4_ = auVar101._20_4_ * 0.0;
            auVar53._24_4_ = auVar101._24_4_ * 0.0;
            auVar53._28_4_ = auVar133._28_4_;
            auVar54._4_4_ = fVar107 * -auVar102._4_4_;
            auVar54._0_4_ = fVar122 * -auVar102._0_4_;
            auVar54._8_4_ = fVar168 * -auVar102._8_4_;
            auVar54._12_4_ = fVar170 * -auVar102._12_4_;
            auVar54._16_4_ = -auVar102._16_4_ * 0.0;
            auVar54._20_4_ = -auVar102._20_4_ * 0.0;
            auVar54._24_4_ = -auVar102._24_4_ * 0.0;
            auVar54._28_4_ = auVar101._28_4_;
            auVar10 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar145,auVar145);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar10));
            auVar55._28_4_ = local_5e0._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar170 * 0.0,
                                    CONCAT48(fVar168 * 0.0,CONCAT44(fVar107 * 0.0,fVar122 * 0.0))));
            fVar122 = auVar133._0_4_;
            fVar107 = auVar133._4_4_;
            fVar168 = auVar133._8_4_;
            fVar170 = auVar133._12_4_;
            fVar172 = auVar133._16_4_;
            fVar184 = auVar133._20_4_;
            fVar185 = auVar133._24_4_;
            auVar56._4_4_ = fVar107 * fVar107 * fVar107 * auVar10._4_4_ * -0.5;
            auVar56._0_4_ = fVar122 * fVar122 * fVar122 * auVar10._0_4_ * -0.5;
            auVar56._8_4_ = fVar168 * fVar168 * fVar168 * auVar10._8_4_ * -0.5;
            auVar56._12_4_ = fVar170 * fVar170 * fVar170 * auVar10._12_4_ * -0.5;
            auVar56._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar56._20_4_ = fVar184 * fVar184 * fVar184 * -0.0;
            auVar56._24_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar56._28_4_ = 0;
            auVar10 = vfmadd231ps_fma(auVar56,auVar202,auVar133);
            fVar122 = auVar10._0_4_;
            fVar107 = auVar10._4_4_;
            auVar57._4_4_ = auVar145._4_4_ * fVar107;
            auVar57._0_4_ = auVar145._0_4_ * fVar122;
            fVar168 = auVar10._8_4_;
            auVar57._8_4_ = auVar145._8_4_ * fVar168;
            fVar170 = auVar10._12_4_;
            auVar57._12_4_ = auVar145._12_4_ * fVar170;
            auVar57._16_4_ = auVar145._16_4_ * 0.0;
            auVar57._20_4_ = auVar145._20_4_ * 0.0;
            auVar57._24_4_ = auVar145._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar107 * -auVar113._4_4_;
            auVar58._0_4_ = fVar122 * -auVar113._0_4_;
            auVar58._8_4_ = fVar168 * -auVar113._8_4_;
            auVar58._12_4_ = fVar170 * -auVar113._12_4_;
            auVar58._16_4_ = -auVar113._16_4_ * 0.0;
            auVar58._20_4_ = -auVar113._20_4_ * 0.0;
            auVar58._24_4_ = -auVar113._24_4_ * 0.0;
            auVar58._28_4_ = auVar133._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar170 * 0.0,
                                    CONCAT48(fVar168 * 0.0,CONCAT44(fVar107 * 0.0,fVar122 * 0.0))));
            auVar10 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar14),local_300);
            auVar133 = ZEXT1632(auVar14);
            auVar11 = vfmadd213ps_fma(auVar54,auVar133,local_560._0_32_);
            auVar12 = vfmadd213ps_fma(auVar55,auVar133,ZEXT1632(auVar9));
            auVar110 = vfnmadd213ps_fma(auVar53,auVar133,local_300);
            auVar13 = vfmadd213ps_fma(auVar57,_local_3e0,local_2e0);
            auVar88 = vfnmadd213ps_fma(auVar54,auVar133,local_560._0_32_);
            auVar90 = vfmadd213ps_fma(auVar58,_local_3e0,local_460);
            local_760 = ZEXT1632(auVar14);
            auVar9 = vfnmadd231ps_fma(ZEXT1632(auVar9),local_760,auVar55);
            auVar89 = vfmadd213ps_fma(auVar59,_local_3e0,local_340);
            auVar111 = vfnmadd213ps_fma(auVar57,_local_3e0,local_2e0);
            auVar136 = vfnmadd213ps_fma(auVar58,_local_3e0,local_460);
            auVar144 = vfnmadd231ps_fma(local_340,_local_3e0,auVar59);
            auVar133 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar88));
            auVar113 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar9));
            auVar60._4_4_ = auVar133._4_4_ * auVar9._4_4_;
            auVar60._0_4_ = auVar133._0_4_ * auVar9._0_4_;
            auVar60._8_4_ = auVar133._8_4_ * auVar9._8_4_;
            auVar60._12_4_ = auVar133._12_4_ * auVar9._12_4_;
            auVar60._16_4_ = auVar133._16_4_ * 0.0;
            auVar60._20_4_ = auVar133._20_4_ * 0.0;
            auVar60._24_4_ = auVar133._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar124 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar88),auVar113);
            auVar61._4_4_ = auVar110._4_4_ * auVar113._4_4_;
            auVar61._0_4_ = auVar110._0_4_ * auVar113._0_4_;
            auVar61._8_4_ = auVar110._8_4_ * auVar113._8_4_;
            auVar61._12_4_ = auVar110._12_4_ * auVar113._12_4_;
            auVar61._16_4_ = auVar113._16_4_ * 0.0;
            auVar61._20_4_ = auVar113._20_4_ * 0.0;
            auVar61._24_4_ = auVar113._24_4_ * 0.0;
            auVar61._28_4_ = auVar113._28_4_;
            auVar118 = ZEXT1632(auVar110);
            auVar113 = vsubps_avx(ZEXT1632(auVar13),auVar118);
            auVar95 = ZEXT1632(auVar9);
            auVar9 = vfmsub231ps_fma(auVar61,auVar95,auVar113);
            auVar62._4_4_ = auVar88._4_4_ * auVar113._4_4_;
            auVar62._0_4_ = auVar88._0_4_ * auVar113._0_4_;
            auVar62._8_4_ = auVar88._8_4_ * auVar113._8_4_;
            auVar62._12_4_ = auVar88._12_4_ * auVar113._12_4_;
            auVar62._16_4_ = auVar113._16_4_ * 0.0;
            auVar62._20_4_ = auVar113._20_4_ * 0.0;
            auVar62._24_4_ = auVar113._24_4_ * 0.0;
            auVar62._28_4_ = auVar113._28_4_;
            auVar110 = vfmsub231ps_fma(auVar62,auVar118,auVar133);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar124));
            auVar15 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,2);
            local_560._0_32_ = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar10),auVar15);
            auVar133 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar11),auVar15);
            auVar113 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar12),auVar15);
            auVar145 = vblendvps_avx(auVar118,ZEXT1632(auVar13),auVar15);
            auVar102 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar90),auVar15);
            auVar101 = vblendvps_avx(auVar95,ZEXT1632(auVar89),auVar15);
            auVar118 = vblendvps_avx(ZEXT1632(auVar13),auVar118,auVar15);
            auVar178 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar88),auVar15);
            auVar9 = vpackssdw_avx(local_400._0_16_,local_400._16_16_);
            auVar95 = vblendvps_avx(ZEXT1632(auVar89),auVar95,auVar15);
            auVar118 = vsubps_avx(auVar118,local_560._0_32_);
            auVar178 = vsubps_avx(auVar178,auVar133);
            auVar17 = vsubps_avx(auVar95,auVar113);
            auVar18 = vsubps_avx(local_560._0_32_,auVar145);
            auVar114 = vsubps_avx(auVar133,auVar102);
            auVar94 = vsubps_avx(auVar113,auVar101);
            auVar154._0_4_ = auVar17._0_4_ * local_560._0_4_;
            auVar154._4_4_ = auVar17._4_4_ * local_560._4_4_;
            auVar154._8_4_ = auVar17._8_4_ * local_560._8_4_;
            auVar154._12_4_ = auVar17._12_4_ * local_560._12_4_;
            auVar154._16_4_ = auVar17._16_4_ * local_560._16_4_;
            auVar154._20_4_ = auVar17._20_4_ * local_560._20_4_;
            auVar154._24_4_ = auVar17._24_4_ * local_560._24_4_;
            auVar154._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar154,auVar113,auVar118);
            auVar63._4_4_ = auVar118._4_4_ * auVar133._4_4_;
            auVar63._0_4_ = auVar118._0_4_ * auVar133._0_4_;
            auVar63._8_4_ = auVar118._8_4_ * auVar133._8_4_;
            auVar63._12_4_ = auVar118._12_4_ * auVar133._12_4_;
            auVar63._16_4_ = auVar118._16_4_ * auVar133._16_4_;
            auVar63._20_4_ = auVar118._20_4_ * auVar133._20_4_;
            auVar63._24_4_ = auVar118._24_4_ * auVar133._24_4_;
            auVar63._28_4_ = auVar95._28_4_;
            auVar11 = vfmsub231ps_fma(auVar63,local_560._0_32_,auVar178);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar155._0_4_ = auVar178._0_4_ * auVar113._0_4_;
            auVar155._4_4_ = auVar178._4_4_ * auVar113._4_4_;
            auVar155._8_4_ = auVar178._8_4_ * auVar113._8_4_;
            auVar155._12_4_ = auVar178._12_4_ * auVar113._12_4_;
            auVar155._16_4_ = auVar178._16_4_ * auVar113._16_4_;
            auVar155._20_4_ = auVar178._20_4_ * auVar113._20_4_;
            auVar155._24_4_ = auVar178._24_4_ * auVar113._24_4_;
            auVar155._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar155,auVar133,auVar17);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar135 = ZEXT1664(auVar11);
            auVar156._0_4_ = auVar94._0_4_ * auVar145._0_4_;
            auVar156._4_4_ = auVar94._4_4_ * auVar145._4_4_;
            auVar156._8_4_ = auVar94._8_4_ * auVar145._8_4_;
            auVar156._12_4_ = auVar94._12_4_ * auVar145._12_4_;
            auVar156._16_4_ = auVar94._16_4_ * auVar145._16_4_;
            auVar156._20_4_ = auVar94._20_4_ * auVar145._20_4_;
            auVar156._24_4_ = auVar94._24_4_ * auVar145._24_4_;
            auVar156._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar156,auVar18,auVar101);
            auVar64._4_4_ = auVar114._4_4_ * auVar101._4_4_;
            auVar64._0_4_ = auVar114._0_4_ * auVar101._0_4_;
            auVar64._8_4_ = auVar114._8_4_ * auVar101._8_4_;
            auVar64._12_4_ = auVar114._12_4_ * auVar101._12_4_;
            auVar64._16_4_ = auVar114._16_4_ * auVar101._16_4_;
            auVar64._20_4_ = auVar114._20_4_ * auVar101._20_4_;
            auVar64._24_4_ = auVar114._24_4_ * auVar101._24_4_;
            auVar64._28_4_ = local_560._28_4_;
            auVar12 = vfmsub231ps_fma(auVar64,auVar102,auVar94);
            auVar65._4_4_ = auVar18._4_4_ * auVar102._4_4_;
            auVar65._0_4_ = auVar18._0_4_ * auVar102._0_4_;
            auVar65._8_4_ = auVar18._8_4_ * auVar102._8_4_;
            auVar65._12_4_ = auVar18._12_4_ * auVar102._12_4_;
            auVar65._16_4_ = auVar18._16_4_ * auVar102._16_4_;
            auVar65._20_4_ = auVar18._20_4_ * auVar102._20_4_;
            auVar65._24_4_ = auVar18._24_4_ * auVar102._24_4_;
            auVar65._28_4_ = auVar102._28_4_;
            auVar13 = vfmsub231ps_fma(auVar65,auVar114,auVar145);
            auVar102 = ZEXT832(0) << 0x20;
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,ZEXT1632(auVar10));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar102,ZEXT1632(auVar12));
            auVar145 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
            auVar145 = vcmpps_avx(auVar145,auVar102,2);
            auVar10 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
            auVar10 = vpand_avx(auVar10,auVar9);
            auVar145 = vpmovsxwd_avx2(auVar10);
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0x7f,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0xbf,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar145[0x1f]) {
LAB_015ecf78:
              auVar141._8_8_ = uStack_498;
              auVar141._0_8_ = local_4a0;
              auVar141._16_8_ = uStack_490;
              auVar141._24_8_ = uStack_488;
              auVar183 = ZEXT3264(auVar179);
              auVar198 = ZEXT3264(auVar195);
            }
            else {
              auVar66._4_4_ = auVar178._4_4_ * auVar94._4_4_;
              auVar66._0_4_ = auVar178._0_4_ * auVar94._0_4_;
              auVar66._8_4_ = auVar178._8_4_ * auVar94._8_4_;
              auVar66._12_4_ = auVar178._12_4_ * auVar94._12_4_;
              auVar66._16_4_ = auVar178._16_4_ * auVar94._16_4_;
              auVar66._20_4_ = auVar178._20_4_ * auVar94._20_4_;
              auVar66._24_4_ = auVar178._24_4_ * auVar94._24_4_;
              auVar66._28_4_ = auVar145._28_4_;
              auVar124 = vfmsub231ps_fma(auVar66,auVar114,auVar17);
              auVar158._0_4_ = auVar17._0_4_ * auVar18._0_4_;
              auVar158._4_4_ = auVar17._4_4_ * auVar18._4_4_;
              auVar158._8_4_ = auVar17._8_4_ * auVar18._8_4_;
              auVar158._12_4_ = auVar17._12_4_ * auVar18._12_4_;
              auVar158._16_4_ = auVar17._16_4_ * auVar18._16_4_;
              auVar158._20_4_ = auVar17._20_4_ * auVar18._20_4_;
              auVar158._24_4_ = auVar17._24_4_ * auVar18._24_4_;
              auVar158._28_4_ = 0;
              auVar89 = vfmsub231ps_fma(auVar158,auVar118,auVar94);
              auVar67._4_4_ = auVar118._4_4_ * auVar114._4_4_;
              auVar67._0_4_ = auVar118._0_4_ * auVar114._0_4_;
              auVar67._8_4_ = auVar118._8_4_ * auVar114._8_4_;
              auVar67._12_4_ = auVar118._12_4_ * auVar114._12_4_;
              auVar67._16_4_ = auVar118._16_4_ * auVar114._16_4_;
              auVar67._20_4_ = auVar118._20_4_ * auVar114._20_4_;
              auVar67._24_4_ = auVar118._24_4_ * auVar114._24_4_;
              auVar67._28_4_ = auVar114._28_4_;
              auVar110 = vfmsub231ps_fma(auVar67,auVar18,auVar178);
              auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar110));
              auVar90 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar124),auVar102);
              auVar145 = vrcpps_avx(ZEXT1632(auVar90));
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = 0x3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar197._16_4_ = 0x3f800000;
              auVar197._20_4_ = 0x3f800000;
              auVar197._24_4_ = 0x3f800000;
              auVar197._28_4_ = 0x3f800000;
              auVar13 = vfnmadd213ps_fma(auVar145,ZEXT1632(auVar90),auVar197);
              auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar145,auVar145);
              auVar68._4_4_ = auVar110._4_4_ * auVar113._4_4_;
              auVar68._0_4_ = auVar110._0_4_ * auVar113._0_4_;
              auVar68._8_4_ = auVar110._8_4_ * auVar113._8_4_;
              auVar68._12_4_ = auVar110._12_4_ * auVar113._12_4_;
              auVar68._16_4_ = auVar113._16_4_ * 0.0;
              auVar68._20_4_ = auVar113._20_4_ * 0.0;
              auVar68._24_4_ = auVar113._24_4_ * 0.0;
              auVar68._28_4_ = auVar133._28_4_;
              auVar89 = vfmadd231ps_fma(auVar68,ZEXT1632(auVar89),auVar133);
              auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar124),local_560._0_32_);
              fVar107 = auVar13._0_4_;
              fVar168 = auVar13._4_4_;
              fVar170 = auVar13._8_4_;
              fVar172 = auVar13._12_4_;
              auVar101 = ZEXT1632(CONCAT412(fVar172 * auVar89._12_4_,
                                            CONCAT48(fVar170 * auVar89._8_4_,
                                                     CONCAT44(fVar168 * auVar89._4_4_,
                                                              fVar107 * auVar89._0_4_))));
              fVar122 = ray->tfar;
              auVar140._4_4_ = fVar122;
              auVar140._0_4_ = fVar122;
              auVar140._8_4_ = fVar122;
              auVar140._12_4_ = fVar122;
              auVar140._16_4_ = fVar122;
              auVar140._20_4_ = fVar122;
              auVar140._24_4_ = fVar122;
              auVar140._28_4_ = fVar122;
              auVar74._8_8_ = uStack_d8;
              auVar74._0_8_ = local_e0;
              auVar74._16_8_ = uStack_d0;
              auVar74._24_8_ = uStack_c8;
              auVar145 = vcmpps_avx(auVar74,auVar101,2);
              auVar102 = vcmpps_avx(auVar101,auVar140,2);
              auVar145 = vandps_avx(auVar102,auVar145);
              auVar13 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              auVar10 = vpand_avx(auVar10,auVar13);
              auVar145 = vpmovsxwd_avx2(auVar10);
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar145 >> 0x7f,0) == '\0') &&
                    (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0xbf,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar145[0x1f]) goto LAB_015ecf78;
              auVar145 = vcmpps_avx(ZEXT1632(auVar90),ZEXT832(0) << 0x20,4);
              auVar13 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              auVar10 = vpand_avx(auVar10,auVar13);
              auVar145 = vpmovsxwd_avx2(auVar10);
              auVar141._8_8_ = uStack_498;
              auVar141._0_8_ = local_4a0;
              auVar141._16_8_ = uStack_490;
              auVar141._24_8_ = uStack_488;
              auVar183 = ZEXT3264(auVar179);
              auVar198 = ZEXT3264(auVar195);
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar118 = ZEXT1632(CONCAT412(fVar172 * auVar11._12_4_,
                                              CONCAT48(fVar170 * auVar11._8_4_,
                                                       CONCAT44(fVar168 * auVar11._4_4_,
                                                                fVar107 * auVar11._0_4_))));
                auVar69._28_4_ = SUB84(uStack_488,4);
                auVar69._0_28_ =
                     ZEXT1628(CONCAT412(fVar172 * auVar12._12_4_,
                                        CONCAT48(fVar170 * auVar12._8_4_,
                                                 CONCAT44(fVar168 * auVar12._4_4_,
                                                          fVar107 * auVar12._0_4_))));
                auVar165._8_4_ = 0x3f800000;
                auVar165._0_8_ = 0x3f8000003f800000;
                auVar165._12_4_ = 0x3f800000;
                auVar165._16_4_ = 0x3f800000;
                auVar165._20_4_ = 0x3f800000;
                auVar165._24_4_ = 0x3f800000;
                auVar165._28_4_ = 0x3f800000;
                auVar102 = vsubps_avx(auVar165,auVar118);
                auVar102 = vblendvps_avx(auVar102,auVar118,auVar15);
                auVar183 = ZEXT3264(auVar102);
                auVar102 = vsubps_avx(auVar165,auVar69);
                local_380 = vblendvps_avx(auVar102,auVar69,auVar15);
                auVar135 = ZEXT3264(local_380);
                auVar198 = ZEXT3264(auVar101);
                auVar141 = auVar145;
              }
            }
            auVar204 = ZEXT3264(local_700);
            auVar203 = ZEXT3264(local_6e0);
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0x7f,0) == '\0') &&
                  (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar141 >> 0xbf,0) == '\0') &&
                (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar141[0x1f]) goto LAB_015ecafb;
            auVar145 = vsubps_avx(_local_3e0,local_760);
            local_240 = auVar183._0_32_;
            auVar10 = vfmadd213ps_fma(auVar145,local_240,local_760);
            fVar122 = local_6a8->depth_scale;
            auVar70._4_4_ = (auVar10._4_4_ + auVar10._4_4_) * fVar122;
            auVar70._0_4_ = (auVar10._0_4_ + auVar10._0_4_) * fVar122;
            auVar70._8_4_ = (auVar10._8_4_ + auVar10._8_4_) * fVar122;
            auVar70._12_4_ = (auVar10._12_4_ + auVar10._12_4_) * fVar122;
            auVar70._16_4_ = fVar122 * 0.0;
            auVar70._20_4_ = fVar122 * 0.0;
            auVar70._24_4_ = fVar122 * 0.0;
            auVar70._28_4_ = fVar122;
            local_200 = auVar198._0_32_;
            auVar145 = vcmpps_avx(local_200,auVar70,6);
            auVar102 = auVar141 & auVar145;
            auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                          CONCAT424(fStack_668,
                                                    CONCAT420(fStack_66c,
                                                              CONCAT416(fStack_670,
                                                                        CONCAT412(fStack_674,
                                                                                  CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
            auVar166 = ZEXT3264(local_6a0);
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar102 >> 0x7f,0) == '\0') &&
                  (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar102 >> 0xbf,0) == '\0') &&
                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar102[0x1f]) {
              auVar121 = ZEXT3264(local_780);
            }
            else {
              auVar120._8_4_ = 0xbf800000;
              auVar120._0_8_ = 0xbf800000bf800000;
              auVar120._12_4_ = 0xbf800000;
              auVar120._16_4_ = 0xbf800000;
              auVar120._20_4_ = 0xbf800000;
              auVar120._24_4_ = 0xbf800000;
              auVar120._28_4_ = 0xbf800000;
              auVar134._8_4_ = 0x40000000;
              auVar134._0_8_ = 0x4000000040000000;
              auVar134._12_4_ = 0x40000000;
              auVar134._16_4_ = 0x40000000;
              auVar134._20_4_ = 0x40000000;
              auVar134._24_4_ = 0x40000000;
              auVar134._28_4_ = 0x40000000;
              auVar135 = ZEXT3264(auVar134);
              auVar10 = vfmadd213ps_fma(local_380,auVar134,auVar120);
              local_220 = ZEXT1632(auVar10);
              local_1dc = iVar7;
              local_1d0 = local_530._0_8_;
              uStack_1c8 = local_530._8_8_;
              local_1c0 = local_5b0._0_8_;
              uStack_1b8 = local_5b0._8_8_;
              local_1b0 = local_5c0._0_8_;
              uStack_1a8 = local_5c0._8_8_;
              pGVar84 = (context->scene->geometries).items[local_6b0].ptr;
              local_380 = ZEXT1632(auVar10);
              auVar102 = local_380;
              if ((pGVar84->mask & ray->mask) == 0) {
                bVar77 = 0;
                auVar121 = ZEXT3264(local_780);
              }
              else {
                auVar121 = ZEXT3264(local_780);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (bVar77 = 1, pGVar84->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_560._0_8_ = pGVar84;
                  local_7c0 = ZEXT1632(CONCAT88(auVar9._8_8_,context));
                  auVar145 = vandps_avx(auVar145,auVar141);
                  local_720 = local_240;
                  fVar123 = (float)local_1e0;
                  auVar135 = ZEXT3264(CONCAT428(fVar123,CONCAT424(fVar123,CONCAT420(fVar123,
                                                  CONCAT416(fVar123,CONCAT412(fVar123,CONCAT48(
                                                  fVar123,CONCAT44(fVar123,fVar123))))))));
                  local_160[0] = (fVar123 + auVar183._0_4_ + 0.0) * local_100;
                  local_160[1] = (fVar123 + auVar183._4_4_ + 1.0) * fStack_fc;
                  local_160[2] = (fVar123 + auVar183._8_4_ + 2.0) * fStack_f8;
                  local_160[3] = (fVar123 + auVar183._12_4_ + 3.0) * fStack_f4;
                  fStack_150 = (fVar123 + auVar183._16_4_ + 4.0) * fStack_f0;
                  fStack_14c = (fVar123 + auVar183._20_4_ + 5.0) * fStack_ec;
                  fStack_148 = (fVar123 + auVar183._24_4_ + 6.0) * fStack_e8;
                  fStack_144 = fVar123 + auVar183._28_4_ + 7.0;
                  local_380._0_8_ = auVar10._0_8_;
                  local_380._8_8_ = auVar10._8_8_;
                  local_140 = local_380._0_8_;
                  uStack_138 = local_380._8_8_;
                  uStack_130 = 0;
                  uStack_128 = 0;
                  local_740 = local_200;
                  local_120 = local_200;
                  uVar82 = vmovmskps_avx(auVar145);
                  local_380 = auVar102;
                  if (uVar82 == 0) {
                    bVar77 = 0;
LAB_015ecfb9:
                    auVar183 = ZEXT3264(local_720);
                    auVar198 = ZEXT3264(local_740);
                    auVar121 = ZEXT3264(local_780);
                    auVar203 = ZEXT3264(local_6e0);
                    auVar204 = ZEXT3264(local_700);
                    auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                                  CONCAT424(fStack_668,
                                                            CONCAT420(fStack_66c,
                                                                      CONCAT416(fStack_670,
                                                                                CONCAT412(fStack_674
                                                                                          ,CONCAT48(
                                                  fStack_678,CONCAT44(fStack_67c,local_680))))))));
                    auVar166 = ZEXT3264(local_6a0);
                    fVar188 = (float)local_660;
                    fVar192 = local_660._4_4_;
                    fVar123 = (float)uStack_658;
                    fVar103 = uStack_658._4_4_;
                    fVar104 = (float)uStack_650;
                    fVar105 = uStack_650._4_4_;
                    fVar106 = (float)uStack_648;
                  }
                  else {
                    uVar79 = CONCAT44(0,uVar82 & 0xff);
                    local_7a0._8_24_ = auVar133._8_24_;
                    local_7a0._0_8_ = uVar79;
                    lVar83 = 0;
                    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      lVar83 = lVar83 + 1;
                    }
                    local_760 = ZEXT1632(CONCAT88(auVar14._8_8_,lVar83));
                    local_600._4_28_ = auVar113._4_28_;
                    local_600._0_4_ = ray->tfar;
                    _local_320 = auVar16;
                    do {
                      local_594 = local_160[local_760._0_8_];
                      local_590 = *(undefined4 *)((long)&local_140 + local_760._0_8_ * 4);
                      ray->tfar = *(float *)(local_120 + local_760._0_8_ * 4);
                      local_630.context = context->user;
                      fVar103 = 1.0 - local_594;
                      fVar123 = fVar103 * fVar103 * -3.0;
                      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * fVar103)),
                                                ZEXT416((uint)(local_594 * fVar103)),
                                                ZEXT416(0xc0000000));
                      auVar9 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar103)),
                                               ZEXT416((uint)(local_594 * local_594)),
                                               ZEXT416(0x40000000));
                      fVar103 = auVar14._0_4_ * 3.0;
                      fVar104 = auVar9._0_4_ * 3.0;
                      fVar105 = local_594 * local_594 * 3.0;
                      auVar152._0_4_ = fVar105 * (float)local_410._0_4_;
                      auVar152._4_4_ = fVar105 * (float)local_410._4_4_;
                      auVar152._8_4_ = fVar105 * fStack_408;
                      auVar152._12_4_ = fVar105 * fStack_404;
                      auVar128._4_4_ = fVar104;
                      auVar128._0_4_ = fVar104;
                      auVar128._8_4_ = fVar104;
                      auVar128._12_4_ = fVar104;
                      auVar14 = vfmadd132ps_fma(auVar128,auVar152,local_5c0);
                      auVar139._4_4_ = fVar103;
                      auVar139._0_4_ = fVar103;
                      auVar139._8_4_ = fVar103;
                      auVar139._12_4_ = fVar103;
                      auVar14 = vfmadd132ps_fma(auVar139,auVar14,local_5b0);
                      auVar129._4_4_ = fVar123;
                      auVar129._0_4_ = fVar123;
                      auVar129._8_4_ = fVar123;
                      auVar129._12_4_ = fVar123;
                      auVar14 = vfmadd132ps_fma(auVar129,auVar14,local_530);
                      auVar135 = ZEXT1664(auVar14);
                      local_5a0 = vmovlps_avx(auVar14);
                      local_598 = vextractps_avx(auVar14,2);
                      local_58c = (int)local_568;
                      local_588 = (int)local_6b0;
                      local_584 = (local_630.context)->instID[0];
                      local_580 = (local_630.context)->instPrimID[0];
                      local_7cc = -1;
                      local_630.valid = &local_7cc;
                      local_630.geometryUserPtr = pGVar84->userPtr;
                      local_630.ray = (RTCRayN *)ray;
                      local_630.hit = (RTCHitN *)&local_5a0;
                      local_630.N = 1;
                      if (pGVar84->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015ece78:
                        p_Var8 = (*(RTCIntersectArguments **)(local_7c0._0_8_ + 0x10))->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           ((((*(RTCIntersectArguments **)(local_7c0._0_8_ + 0x10))->flags &
                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_560._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar135 = ZEXT1664(auVar135._0_16_);
                          (*p_Var8)(&local_630);
                          if (*local_630.valid == 0) goto LAB_015ecec3;
                        }
                        bVar77 = 1;
                        goto LAB_015ecfb9;
                      }
                      auVar135 = ZEXT1664(auVar14);
                      (*pGVar84->occlusionFilterN)(&local_630);
                      if (*local_630.valid != 0) goto LAB_015ece78;
LAB_015ecec3:
                      ray->tfar = (float)local_600._0_4_;
                      uVar81 = local_7a0._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
                      bVar77 = 0;
                      local_7a0._0_8_ = uVar81;
                      lVar83 = 0;
                      for (uVar79 = uVar81; (uVar79 & 1) == 0;
                          uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                        lVar83 = lVar83 + 1;
                      }
                      local_760._0_8_ = lVar83;
                      auVar183 = ZEXT3264(local_720);
                      auVar198 = ZEXT3264(local_740);
                      auVar121 = ZEXT3264(local_780);
                      auVar203 = ZEXT3264(local_6e0);
                      auVar204 = ZEXT3264(local_700);
                      auVar160 = ZEXT3264(CONCAT428(fStack_664,
                                                    CONCAT424(fStack_668,
                                                              CONCAT420(fStack_66c,
                                                                        CONCAT416(fStack_670,
                                                                                  CONCAT412(
                                                  fStack_674,
                                                  CONCAT48(fStack_678,CONCAT44(fStack_67c,local_680)
                                                          )))))));
                      auVar166 = ZEXT3264(local_6a0);
                      pGVar84 = (Geometry *)local_560._0_8_;
                      context = (RayQueryContext *)local_7c0._0_8_;
                      fVar188 = (float)local_660;
                      fVar192 = local_660._4_4_;
                      fVar123 = (float)uStack_658;
                      fVar103 = uStack_658._4_4_;
                      fVar104 = (float)uStack_650;
                      fVar105 = uStack_650._4_4_;
                      fVar106 = (float)uStack_648;
                    } while (uVar81 != 0);
                  }
                }
              }
              bVar85 = (bool)(bVar85 | bVar77);
            }
          }
          local_720 = auVar183._0_32_;
          local_740 = auVar198._0_32_;
          lVar80 = lVar80 + 8;
          auVar142 = ZEXT3264(local_5e0);
          context = (RayQueryContext *)local_7c0._0_8_;
        } while ((int)lVar80 < iVar7);
      }
      if (bVar85) {
        return bVar85;
      }
      fVar123 = ray->tfar;
      auVar93._4_4_ = fVar123;
      auVar93._0_4_ = fVar123;
      auVar93._8_4_ = fVar123;
      auVar93._12_4_ = fVar123;
      auVar14 = vcmpps_avx(local_2a0,auVar93,2);
      uVar82 = vmovmskps_avx(auVar14);
      uVar78 = uVar78 & uVar78 + 0xf & uVar82;
      context = (RayQueryContext *)local_7c0._0_8_;
    } while (uVar78 != 0);
  }
  return bVar85;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }